

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraphFlattener::convertInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,
          vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          *spaces)

{
  Vector *pVVar1;
  pointer pTVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  ulong *puVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 *paVar8;
  undefined8 *puVar9;
  float fVar10;
  undefined8 uVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined1 auVar13 [16];
  bool bVar14;
  Node *pNVar15;
  size_t sVar16;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar17;
  long lVar18;
  Ref<embree::SceneGraph::Node> *pRVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  byte bVar61;
  undefined4 uVar62;
  BBox1f this_00;
  long *plVar63;
  ulong uVar64;
  undefined8 uVar65;
  pointer pTVar66;
  runtime_error *prVar67;
  byte bVar69;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong uVar70;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong extraout_RDX_16;
  ulong extraout_RDX_17;
  ulong extraout_RDX_18;
  ulong extraout_RDX_19;
  ulong extraout_RDX_20;
  ulong extraout_RDX_21;
  ulong extraout_RDX_22;
  ulong extraout_RDX_23;
  Ref<embree::SceneGraph::Node> *child;
  ulong uVar71;
  Ref<embree::SceneGraph::Node> *pRVar72;
  undefined8 *puVar73;
  long lVar74;
  uint uVar75;
  int iVar76;
  uint uVar77;
  int iVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined4 uVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  Transformations c;
  float local_198;
  float local_188;
  float fStack_184;
  undefined1 local_178 [16];
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> local_168;
  undefined8 local_128;
  long lStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 local_108;
  undefined1 local_f8 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 local_e8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  Ref<embree::SceneGraph::Node> *local_90;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_88;
  SceneGraphFlattener *local_80;
  undefined8 local_78;
  ulong uStack_70;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  Node *local_50;
  undefined1 local_48 [16];
  pointer local_38;
  undefined7 uVar68;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  
  pNVar15 = node->ptr;
  local_168.p.field_0._8_8_ = spaces;
  local_88 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              *)group;
  local_80 = this;
  if (pNVar15->closed == true) {
    this_00 = (BBox1f)alignedMalloc(0x88,0x10);
    local_50 = node->ptr;
    if (local_50 != (Node *)0x0) {
      (*(local_50->super_RefCount)._vptr_RefCount[2])();
    }
    lookupGeometries((SceneGraphFlattener *)local_48,&local_80->node);
    SceneGraph::MultiTransformNode::MultiTransformNode
              ((MultiTransformNode *)this_00,
               (vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                *)local_168.p.field_0._8_8_,(Ref<embree::SceneGraph::Node> *)local_48);
    local_178._0_8_ = this_00;
    (**(code **)(*(long *)this_00 + 0x10))(this_00);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
              (local_88,(Ref<embree::SceneGraph::Node> *)local_178);
    if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
      (**(code **)(*(long *)local_178._0_8_ + 0x18))();
    }
    if ((Node *)local_48._0_8_ != (Node *)0x0) {
      (*((RefCount *)local_48._0_8_)->_vptr_RefCount[3])();
    }
    if (local_50 != (Node *)0x0) {
      (*(local_50->super_RefCount)._vptr_RefCount[3])();
    }
  }
  else {
    plVar63 = (long *)__dynamic_cast(pNVar15,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::TransformNode::typeinfo,0);
    if (plVar63 == (long *)0x0) {
      plVar63 = (long *)__dynamic_cast(pNVar15,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::MultiTransformNode::typeinfo,0);
      if (plVar63 == (long *)0x0) {
        plVar63 = (long *)__dynamic_cast(pNVar15,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::GroupNode::typeinfo,0);
        if (plVar63 != (long *)0x0) {
          (**(code **)(*plVar63 + 0x10))(plVar63);
          pRVar19 = (Ref<embree::SceneGraph::Node> *)plVar63[0xe];
          for (pRVar72 = (Ref<embree::SceneGraph::Node> *)plVar63[0xd]; pRVar72 != pRVar19;
              pRVar72 = pRVar72 + 1) {
            convertInstances(local_80,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                       *)local_88,pRVar72,
                             (vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                              *)local_168.p.field_0._8_8_);
          }
          (**(code **)(*plVar63 + 0x18))(plVar63);
        }
      }
      else {
        (**(code **)(*plVar63 + 0x10))(plVar63);
        pTVar66 = *(pointer *)local_168.p.field_0._8_8_;
        uVar70 = (long)*(pointer *)(local_168.p.field_0._8_8_ + 8) - (long)pTVar66;
        local_90 = (Ref<embree::SceneGraph::Node> *)plVar63;
        if (uVar70 != plVar63[0xe] - plVar63[0xd]) {
          prVar67 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar67,"number of transformations does not match");
          __cxa_throw(prVar67,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_48._0_8_ = (Node *)0x0;
        local_48._8_8_ = (pointer)0x0;
        local_38 = (pointer)0x0;
        if (*(pointer *)(local_168.p.field_0._8_8_ + 8) != pTVar66) {
          uVar71 = 0;
          do {
            pTVar2 = pTVar66 + uVar71;
            puVar73 = (undefined8 *)(*(long *)(local_90 + 0xd) + uVar71 * 0x30);
            sVar16 = pTVar66[uVar71].spaces.size_active;
            local_78 = uVar71;
            if (sVar16 == 1) {
              fVar79 = (pTVar2->time_range).lower;
              fVar81 = (pTVar2->time_range).upper;
              fVar97 = (float)*puVar73;
              fVar125 = (float)((ulong)*puVar73 >> 0x20);
              uVar75 = -(uint)(fVar79 < fVar97);
              uVar77 = -(uint)(fVar81 < fVar125);
              local_178._0_8_ =
                   CONCAT44(~uVar77 & (uint)fVar125,~uVar75 & (uint)fVar79) |
                   CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
              sVar16 = puVar73[2];
              uVar65 = &local_168;
              local_168.l.vx.field_0._0_8_ = 0;
              local_168.l.vx.field_0._8_8_ = 0;
              local_168.l.vy.field_0._0_8_ =
                   (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
              if (sVar16 != 0) {
                uVar65 = alignedMalloc(sVar16 << 6,0x10);
                uVar70 = extraout_RDX_12;
                local_168.l.vx.field_0._8_8_ = sVar16;
                local_168.l.vy.field_0._0_8_ = uVar65;
              }
              local_168.l.vy.field_0._8_1_ = false;
              local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
              if (puVar73[2] != 0) {
                lVar74 = 0x30;
                uVar71 = 0;
                do {
                  uVar75 = (uint)uVar70;
                  pAVar17 = (pTVar2->spaces).items;
                  lVar18 = puVar73[4];
                  bVar14 = pTVar2->quaternion;
                  bVar61 = *(byte *)(puVar73 + 5);
                  local_168.l.vy.field_0._8_1_ = false;
                  fVar79 = (pAVar17->l).vx.field_0.m128[0];
                  uVar11 = *(undefined8 *)((long)&(pAVar17->l).vx.field_0 + 4);
                  fVar81 = (float)((ulong)uVar11 >> 0x20);
                  local_198 = (float)uVar11;
                  if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                      ((NAN(local_198) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_00165794:
                    uVar11 = *(undefined8 *)(lVar18 + -0x30 + lVar74);
                    fVar97 = (float)uVar11;
                    fVar125 = (float)((ulong)uVar11 >> 0x20);
                    iVar76 = -(uint)(fVar97 != 1.0);
                    iVar78 = -(uint)(fVar125 != 0.0);
                    auVar89._4_4_ = iVar78;
                    auVar89._0_4_ = iVar76;
                    auVar89._8_4_ = iVar78;
                    auVar89._12_4_ = iVar78;
                    auVar88._8_8_ = auVar89._8_8_;
                    auVar88._4_4_ = iVar76;
                    auVar88._0_4_ = iVar76;
                    uVar75 = movmskpd(uVar75,auVar88);
                    uVar70 = (ulong)uVar75;
                    fVar79 = *(float *)(lVar18 + -0x28 + lVar74);
                    if ((uVar75 & 1) == 0) {
                      bVar69 = (byte)uVar75 >> 1;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                      uVar70 = (ulong)uVar75;
                      if (((bVar69 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                        pfVar3 = (float *)(lVar18 + -0x24 + lVar74);
                        auVar52._4_4_ = -(uint)(pfVar3[1] != 0.0);
                        auVar52._0_4_ = -(uint)(*pfVar3 != 0.0);
                        auVar52._8_4_ = -(uint)(pfVar3[2] != 1.0);
                        auVar52._12_4_ = -(uint)(pfVar3[3] != 0.0);
                        uVar75 = movmskps(uVar75,auVar52);
                        uVar70 = (ulong)uVar75;
                        if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                           ((uVar75 & 4) == 0)) {
                          bVar69 = ((byte)uVar75 & 8) >> 3;
                          uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                          uVar70 = (ulong)uVar75;
                          if (bVar69 == 0) {
                            pfVar3 = (float *)(lVar18 + -0x14 + lVar74);
                            auVar53._4_4_ = -(uint)(pfVar3[1] != 0.0);
                            auVar53._0_4_ = -(uint)(*pfVar3 != 0.0);
                            auVar53._8_4_ = -(uint)(pfVar3[2] != 0.0);
                            auVar53._12_4_ = -(uint)(pfVar3[3] != 1.0);
                            uVar75 = movmskps(uVar75,auVar53);
                            uVar70 = (ulong)uVar75;
                            if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                               ((uVar75 & 4) == 0)) {
                              bVar69 = ((byte)uVar75 & 8) >> 3;
                              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                              uVar70 = (ulong)uVar75;
                              if (bVar69 == 0) {
                                pfVar3 = (float *)(lVar18 + -4 + lVar74);
                                auVar54._4_4_ = -(uint)(pfVar3[1] != 0.0);
                                auVar54._0_4_ = -(uint)(*pfVar3 != 0.0);
                                auVar54._8_4_ = -(uint)(pfVar3[2] != 0.0);
                                auVar54._12_4_ = -(uint)(pfVar3[3] != 0.0);
                                uVar75 = movmskps(uVar75,auVar54);
                                uVar70 = (ulong)uVar75;
                                if ((((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                                     ((uVar75 & 4) == 0)) &&
                                    (bVar69 = ((byte)uVar75 & 8) >> 3,
                                    uVar70 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar69),
                                    bVar69 == 0)) &&
                                   ((bVar61 == 0 ||
                                    ((fVar80 = *(float *)(lVar18 + 0xc + lVar74), fVar80 == 1.0 &&
                                     (!NAN(fVar80))))))) {
                                  fVar107 = (pAVar17->l).vx.field_0.m128[0];
                                  local_198 = (pAVar17->l).vx.field_0.m128[1];
                                  fVar81 = (pAVar17->l).vx.field_0.m128[2];
                                  fVar79 = (pAVar17->l).vx.field_0.m128[3];
                                  uVar62 = (pAVar17->l).vy.field_0.m128[0];
                                  uVar118 = (pAVar17->l).vy.field_0.m128[1];
                                  fVar113 = (pAVar17->l).vy.field_0.m128[2];
                                  fVar97 = (pAVar17->l).vy.field_0.m128[3];
                                  fVar80 = (pAVar17->l).vz.field_0.m128[0];
                                  fVar128 = (pAVar17->l).vz.field_0.m128[1];
                                  fVar106 = (pAVar17->l).vz.field_0.m128[2];
                                  fVar111 = (pAVar17->l).vz.field_0.m128[3];
                                  fVar125 = (pAVar17->p).field_0.m128[0];
                                  fVar99 = (pAVar17->p).field_0.m128[1];
                                  fVar105 = (pAVar17->p).field_0.m128[2];
                                  fVar94 = (pAVar17->p).field_0.m128[3];
                                  local_168.l.vy.field_0._8_1_ = bVar14;
                                  goto LAB_0016626b;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if ((bVar14 == false) && (bVar61 == 0)) {
                      fVar129 = (pAVar17->l).vx.field_0.m128[0];
                      fVar135 = (pAVar17->l).vx.field_0.m128[1];
                      fVar138 = (pAVar17->l).vx.field_0.m128[2];
                      fVar95 = (pAVar17->l).vx.field_0.m128[3];
                      fVar96 = (pAVar17->l).vy.field_0.m128[0];
                      fVar100 = (pAVar17->l).vy.field_0.m128[1];
                      fVar131 = (pAVar17->l).vy.field_0.m128[2];
                      fVar101 = (pAVar17->l).vy.field_0.m128[3];
                      fVar102 = (pAVar17->l).vz.field_0.m128[0];
                      fVar136 = (pAVar17->l).vz.field_0.m128[1];
                      fVar103 = (pAVar17->l).vz.field_0.m128[2];
                      fVar137 = (pAVar17->l).vz.field_0.m128[3];
                      fVar107 = fVar97 * fVar129 + fVar125 * fVar96 + fVar79 * fVar102;
                      local_198 = fVar97 * fVar135 + fVar125 * fVar100 + fVar79 * fVar136;
                      fVar81 = fVar97 * fVar138 + fVar125 * fVar131 + fVar79 * fVar103;
                      fVar10 = *(float *)(lVar18 + -0x20 + lVar74);
                      fVar98 = *(float *)(lVar18 + -0x1c + lVar74);
                      fVar126 = *(float *)(lVar18 + -0x18 + lVar74);
                      fVar111 = *(float *)(lVar18 + -0x10 + lVar74);
                      fVar99 = *(float *)(lVar18 + -0xc + lVar74);
                      fVar105 = *(float *)(lVar18 + -8 + lVar74);
                      fVar80 = fVar111 * fVar129 + fVar99 * fVar96 + fVar105 * fVar102;
                      fVar128 = fVar111 * fVar135 + fVar99 * fVar100 + fVar105 * fVar136;
                      fVar106 = fVar111 * fVar138 + fVar99 * fVar131 + fVar105 * fVar103;
                      fVar94 = *(float *)(lVar18 + lVar74);
                      fVar113 = *(float *)(lVar18 + 4 + lVar74);
                      fVar127 = *(float *)(lVar18 + 8 + lVar74);
                      fVar111 = fVar111 * fVar95 + fVar99 * fVar101 + fVar105 * fVar137;
                      fVar79 = fVar97 * fVar95 + fVar125 * fVar101 + fVar79 * fVar137;
                      fVar125 = fVar94 * fVar129 + fVar113 * fVar96 + fVar127 * fVar102 +
                                (pAVar17->p).field_0.m128[0];
                      fVar99 = fVar94 * fVar135 + fVar113 * fVar100 + fVar127 * fVar136 +
                               (pAVar17->p).field_0.m128[1];
                      fVar105 = fVar94 * fVar138 + fVar113 * fVar131 + fVar127 * fVar103 +
                                (pAVar17->p).field_0.m128[2];
                      fVar94 = fVar94 * fVar95 + fVar113 * fVar101 + fVar127 * fVar137 +
                               (pAVar17->p).field_0.m128[3];
                      uVar62 = fVar10 * fVar129 + fVar98 * fVar96 + fVar126 * fVar102;
                      uVar118 = fVar10 * fVar135 + fVar98 * fVar100 + fVar126 * fVar136;
                      fVar113 = fVar10 * fVar138 + fVar98 * fVar131 + fVar126 * fVar103;
                      fVar97 = fVar10 * fVar95 + fVar98 * fVar101 + fVar126 * fVar137;
                    }
                    else if ((bVar14 == false) || (bVar61 == 0)) {
                      if ((bVar14 == false) || (bVar61 != 0)) {
                        if ((local_198 != 0.0) ||
                           ((((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))) ||
                            (uVar11 = *(undefined8 *)&(pAVar17->l).vz.field_0,
                            auVar35._4_4_ = -(uint)((pAVar17->l).vy.field_0.m128[0] != 0.0),
                            auVar35._0_4_ = -(uint)((pAVar17->l).vy.field_0.m128[2] != 0.0),
                            auVar35._8_4_ = -(uint)((float)uVar11 != 0.0),
                            auVar35._12_4_ = -(uint)((float)((ulong)uVar11 >> 0x20) != 0.0),
                            uVar62 = movmskps((int)CONCAT71((int7)((ulong)uVar65 >> 8),bVar61),
                                              auVar35), (char)uVar62 != '\0')))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_15;
                        }
                        pfVar4 = (float *)(lVar18 + -0x30 + lVar74);
                        fVar79 = pfVar4[3];
                        pfVar5 = (float *)(lVar18 + -0x20 + lVar74);
                        uVar62 = *pfVar5;
                        fVar97 = pfVar5[3];
                        pfVar6 = (float *)(lVar18 + -0x10 + lVar74);
                        fVar80 = *pfVar6;
                        fVar128 = pfVar6[1];
                        fVar111 = pfVar6[3];
                        pfVar3 = (float *)(lVar18 + lVar74);
                        fVar125 = *pfVar3;
                        fVar99 = pfVar3[1];
                        fVar105 = pfVar3[2];
                        fVar94 = pfVar3[3];
                        uVar65 = *(undefined8 *)&(pAVar17->p).field_0;
                        fVar107 = (pAVar17->l).vx.field_0.m128[0] * *pfVar4;
                        local_198 = pfVar4[1] + (float)uVar65;
                        fVar81 = pfVar4[2] + (float)((ulong)uVar65 >> 0x20);
                        fVar113 = pfVar5[2] + (pAVar17->p).field_0.m128[2];
                        uVar118 = pfVar5[1] * (pAVar17->l).vy.field_0.m128[1];
                        fVar106 = pfVar6[2] * (pAVar17->l).vz.field_0.m128[2];
                        local_168.l.vy.field_0._8_1_ = true;
                      }
                      else {
                        local_e8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                    )ZEXT416((uint)(pAVar17->p).field_0.m128[3]);
                        local_c8 = ZEXT416((uint)(pAVar17->l).vx.field_0.m128[3]);
                        _local_b8 = ZEXT416((uint)(pAVar17->l).vy.field_0.m128[3]);
                        local_f8 = ZEXT416((uint)(pAVar17->l).vz.field_0.m128[3]);
                        pVVar1 = &(pAVar17->l).vy;
                        local_118 = (pVVar1->field_0).m128[0];
                        fStack_114 = (pAVar17->l).vy.field_0.m128[1];
                        fStack_10c = (pAVar17->l).vy.field_0.m128[3];
                        local_d8 = (pVVar1->field_0).field_1;
                        pVVar1 = &(pAVar17->l).vz;
                        fVar97 = (pVVar1->field_0).m128[0];
                        fVar125 = (pAVar17->l).vz.field_0.m128[1];
                        fVar80 = (pAVar17->l).vz.field_0.m128[2];
                        fVar128 = (pAVar17->l).vz.field_0.m128[3];
                        local_108 = (pVVar1->field_0).field_1;
                        fVar79 = (pAVar17->l).vx.field_0.m128[0];
                        fStack_5c = (pAVar17->l).vx.field_0.m128[1];
                        pfVar3 = (float *)(lVar18 + -0x30 + lVar74);
                        fVar111 = *pfVar3;
                        fVar99 = pfVar3[1];
                        fVar105 = pfVar3[2];
                        pfVar3 = (float *)(lVar18 + -0x20 + lVar74);
                        fVar94 = *pfVar3;
                        fVar113 = pfVar3[1];
                        fVar106 = pfVar3[2];
                        puVar9 = (undefined8 *)(lVar18 + -0x10 + lVar74);
                        local_128 = *puVar9;
                        lStack_120 = puVar9[1];
                        pfVar3 = (float *)(lVar18 + lVar74);
                        fVar10 = *pfVar3;
                        fVar98 = pfVar3[1];
                        fVar126 = pfVar3[2];
                        fVar107 = fVar111 * fVar79 + fVar99 * local_118 + fVar105 * fVar97;
                        fVar127 = fVar111 * 0.0 + fVar99 * fStack_114 + fVar105 * fVar125;
                        fVar111 = fVar111 * 0.0 + fVar99 * 0.0 + fVar105 * fVar80;
                        local_168.l.vz.field_0.m128[0] =
                             fVar94 * fVar79 + fVar113 * local_118 + fVar106 * fVar97;
                        local_168.l.vz.field_0.m128[1] =
                             fVar94 * 0.0 + fVar113 * fStack_114 + fVar106 * fVar125;
                        local_168.l.vz.field_0.m128[2] =
                             fVar94 * 0.0 + fVar113 * 0.0 + fVar106 * fVar80;
                        local_168.l.vz.field_0.m128[3] =
                             fVar94 * fStack_5c + fVar113 * fStack_10c + fVar106 * fVar128;
                        fStack_110 = 0.0;
                        local_68 = (ulong)(uint)fVar79;
                        fStack_60 = 0.0;
                        local_a8._0_4_ =
                             fVar10 * fVar79 + fVar98 * local_118 + fVar126 * fVar97 +
                             (pAVar17->p).field_0.m128[0];
                        local_a8._4_4_ =
                             fVar10 * 0.0 + fVar98 * fStack_114 + fVar126 * fVar125 +
                             (pAVar17->p).field_0.m128[1];
                        fStack_a0 = fVar10 * 0.0 + fVar98 * 0.0 + fVar126 * fVar80 +
                                    (pAVar17->p).field_0.m128[2];
                        fStack_9c = fVar10 * fStack_5c + fVar98 * fStack_10c + fVar126 * fVar128 +
                                    (pAVar17->p).field_0.m128[3];
                        if ((((fVar127 != 0.0) || (NAN(fVar127))) ||
                            ((fVar111 != 0.0 ||
                             ((NAN(fVar111) || (local_168.l.vz.field_0.m128[2] != 0.0)))))) ||
                           (NAN(local_168.l.vz.field_0.m128[2]))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_14;
                        }
                        fVar80 = (float)local_68 * (float)local_128 +
                                 local_118 * local_128._4_4_ + local_108.x * (float)lStack_120;
                        fVar128 = local_68._4_4_ * (float)local_128 +
                                  fStack_114 * local_128._4_4_ + local_108.y * (float)lStack_120;
                        fVar106 = fStack_60 * (float)local_128 +
                                  fStack_110 * local_128._4_4_ + local_108.z * (float)lStack_120;
                        local_168.l.vy.field_0._8_1_ = true;
                        fVar111 = (float)local_f8._0_4_;
                        fVar79 = (float)local_c8._0_4_;
                        fVar125 = (float)local_a8._0_4_;
                        fVar99 = (float)local_a8._4_4_;
                        fVar105 = fStack_a0;
                        fVar94 = local_e8.x;
                        uVar62 = local_168.l.vz.field_0.m128[0];
                        uVar118 = local_168.l.vz.field_0.m128[1];
                        fVar113 = local_d8.z;
                        fVar97 = (float)local_b8._0_4_;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                      std::ostream::put(-0x38);
                      std::ostream::flush();
                      fVar79 = (pAVar17->p).field_0.m128[3];
                      fVar81 = (pAVar17->l).vx.field_0.m128[3];
                      fVar97 = (pAVar17->l).vy.field_0.m128[3];
                      fVar125 = (pAVar17->l).vz.field_0.m128[3];
                      aVar12 = (pAVar17->l).vx.field_0.field_1;
                      fVar80 = (pAVar17->l).vy.field_0.m128[0];
                      fVar128 = (pAVar17->l).vy.field_0.m128[1];
                      fVar111 = (pAVar17->l).vz.field_0.m128[0];
                      fVar99 = (pAVar17->l).vz.field_0.m128[1];
                      fVar105 = (pAVar17->l).vz.field_0.m128[2];
                      fVar129 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar106 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar98 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                               -fVar125 * fVar125;
                      fVar126 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar127 = fVar97 * fVar97 + fVar126 + -fVar125 * fVar125;
                      fVar138 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar107 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar135 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar79 = fVar97 * fVar125 - fVar79 * fVar81;
                      fVar94 = (pAVar17->p).field_0.m128[0];
                      fVar113 = (pAVar17->p).field_0.m128[1];
                      fVar10 = (pAVar17->p).field_0.m128[2];
                      fVar129 = fVar129 + fVar129;
                      fVar138 = fVar138 + fVar138;
                      fVar106 = fVar106 + fVar106;
                      fVar135 = fVar135 + fVar135;
                      fVar107 = fVar107 + fVar107;
                      fVar79 = fVar79 + fVar79;
                      fVar81 = fVar125 * fVar125 + fVar126 + -fVar97 * fVar97;
                      fVar114 = fVar98 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar116 = fVar98 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                      fVar119 = fVar98 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                      fVar120 = fVar98 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar108 = fVar106 * 1.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar109 = fVar106 * 0.0 + fVar127 * 1.0 + fVar135 * 0.0;
                      fVar110 = fVar106 * 0.0 + fVar127 * 0.0 + fVar135 * 1.0;
                      fVar112 = fVar106 * 0.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar98 = fVar107 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      fVar127 = fVar107 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                      fVar135 = fVar107 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                      fVar95 = fVar107 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      local_188 = aVar12.y;
                      fStack_184 = aVar12.z;
                      local_198 = aVar12.x;
                      fVar124 = local_198 * fVar114 + fVar108 * 0.0 + fVar98 * 0.0;
                      fVar130 = local_198 * fVar116 + fVar109 * 0.0 + fVar127 * 0.0;
                      fVar132 = local_198 * fVar119 + fVar110 * 0.0 + fVar135 * 0.0;
                      fVar133 = local_198 * fVar120 + fVar112 * 0.0 + fVar95 * 0.0;
                      fVar126 = fVar80 * fVar114 + fVar128 * fVar108 + fVar98 * 0.0;
                      fVar129 = fVar80 * fVar116 + fVar128 * fVar109 + fVar127 * 0.0;
                      fVar138 = fVar80 * fVar119 + fVar128 * fVar110 + fVar135 * 0.0;
                      fVar96 = fVar80 * fVar120 + fVar128 * fVar112 + fVar95 * 0.0;
                      local_168.l.vz.field_0.m128[0] =
                           fVar111 * fVar114 + fVar99 * fVar108 + fVar105 * fVar98;
                      local_168.l.vz.field_0.m128[1] =
                           fVar111 * fVar116 + fVar99 * fVar109 + fVar105 * fVar127;
                      local_168.l.vz.field_0.m128[2] =
                           fVar111 * fVar119 + fVar99 * fVar110 + fVar105 * fVar135;
                      local_168.l.vz.field_0.m128[3] =
                           fVar111 * fVar120 + fVar99 * fVar112 + fVar105 * fVar95;
                      fVar79 = *(float *)(lVar18 + 0xc + lVar74);
                      fVar81 = *(float *)(lVar18 + -0x24 + lVar74);
                      fVar97 = *(float *)(lVar18 + -0x14 + lVar74);
                      fVar125 = *(float *)(lVar18 + -4 + lVar74);
                      fVar131 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar106 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar100 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                                -fVar125 * fVar125;
                      fVar128 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar137 = fVar97 * fVar97 + fVar128 + -fVar125 * fVar125;
                      fVar136 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar103 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar139 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar107 = fVar97 * fVar125 - fVar79 * fVar81;
                      pfVar4 = (float *)(lVar18 + -0x30 + lVar74);
                      fVar79 = *pfVar4;
                      pfVar5 = (float *)(lVar18 + -0x20 + lVar74);
                      fVar81 = *pfVar5;
                      fVar80 = pfVar5[1];
                      fVar122 = fVar125 * fVar125 + fVar128 + -fVar97 * fVar97;
                      pfVar3 = (float *)(lVar18 + -0x10 + lVar74);
                      fVar97 = *pfVar3;
                      fVar125 = pfVar3[1];
                      fVar128 = pfVar3[2];
                      fVar131 = fVar131 + fVar131;
                      fVar136 = fVar136 + fVar136;
                      pfVar3 = (float *)(lVar18 + lVar74);
                      fVar111 = *pfVar3;
                      fVar99 = pfVar3[1];
                      fVar105 = pfVar3[2];
                      fVar101 = fVar100 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                      fVar102 = fVar100 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                      fVar136 = fVar100 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                      fVar106 = fVar106 + fVar106;
                      fVar139 = fVar139 + fVar139;
                      fVar103 = fVar103 + fVar103;
                      fVar107 = fVar107 + fVar107;
                      fVar100 = fVar106 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                      fVar131 = fVar106 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                      fVar106 = fVar106 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                      fVar137 = fVar103 * 1.0 + fVar107 * 0.0 + fVar122 * 0.0;
                      fVar139 = fVar103 * 0.0 + fVar107 * 1.0 + fVar122 * 0.0;
                      fVar107 = fVar103 * 0.0 + fVar107 * 0.0 + fVar122 * 1.0;
                      fVar115 = fVar79 * fVar101 + fVar100 * 0.0 + fVar137 * 0.0;
                      fVar117 = fVar79 * fVar102 + fVar131 * 0.0 + fVar139 * 0.0;
                      fVar79 = fVar79 * fVar136 + fVar106 * 0.0 + fVar107 * 0.0;
                      fVar103 = fVar81 * fVar101 + fVar80 * fVar100 + fVar137 * 0.0;
                      fVar122 = fVar81 * fVar102 + fVar80 * fVar131 + fVar139 * 0.0;
                      fVar104 = fVar81 * fVar136 + fVar80 * fVar106 + fVar107 * 0.0;
                      fVar121 = fVar97 * fVar101 + fVar125 * fVar100 + fVar128 * fVar137;
                      fVar123 = fVar97 * fVar102 + fVar125 * fVar131 + fVar128 * fVar139;
                      fVar125 = fVar97 * fVar136 + fVar125 * fVar106 + fVar128 * fVar107;
                      fVar97 = fVar111 * fVar101 + fVar99 * fVar100 + fVar105 * fVar137 +
                               pfVar4[1] + 0.0;
                      fVar100 = fVar111 * fVar102 + fVar99 * fVar131 + fVar105 * fVar139 +
                                pfVar4[2] + 0.0;
                      fVar131 = fVar111 * fVar136 + fVar99 * fVar106 + fVar105 * fVar107 +
                                pfVar5[2] + 0.0;
                      fVar107 = fVar115 * fVar124 +
                                fVar117 * fVar126 + fVar79 * local_168.l.vz.field_0.m128[0];
                      local_198 = fVar115 * fVar130 +
                                  fVar117 * fVar129 + fVar79 * local_168.l.vz.field_0.m128[1];
                      fVar81 = fVar115 * fVar132 +
                               fVar117 * fVar138 + fVar79 * local_168.l.vz.field_0.m128[2];
                      fVar80 = fVar121 * fVar124 +
                               fVar123 * fVar126 + fVar125 * local_168.l.vz.field_0.m128[0];
                      fVar128 = fVar121 * fVar130 +
                                fVar123 * fVar129 + fVar125 * local_168.l.vz.field_0.m128[1];
                      fVar106 = fVar121 * fVar132 +
                                fVar123 * fVar138 + fVar125 * local_168.l.vz.field_0.m128[2];
                      uVar70 = extraout_RDX_13;
                      fVar111 = fVar121 * fVar133 +
                                fVar123 * fVar96 + fVar125 * local_168.l.vz.field_0.m128[3];
                      fVar79 = fVar115 * fVar133 +
                               fVar117 * fVar96 + fVar79 * local_168.l.vz.field_0.m128[3];
                      fVar125 = fVar97 * fVar124 +
                                fVar100 * fVar126 + fVar131 * local_168.l.vz.field_0.m128[0] +
                                fVar94 * fVar114 + fVar113 * fVar108 + fVar10 * fVar98 +
                                local_188 + 0.0;
                      fVar99 = fVar97 * fVar130 +
                               fVar100 * fVar129 + fVar131 * local_168.l.vz.field_0.m128[1] +
                               fVar94 * fVar116 + fVar113 * fVar109 + fVar10 * fVar127 +
                               fStack_184 + 0.0;
                      fVar105 = fVar97 * fVar132 +
                                fVar100 * fVar138 + fVar131 * local_168.l.vz.field_0.m128[2] +
                                fVar94 * fVar119 + fVar113 * fVar110 + fVar10 * fVar135 +
                                (pAVar17->l).vy.field_0.m128[2] + 0.0;
                      fVar94 = fVar97 * fVar133 +
                               fVar100 * fVar96 + fVar131 * local_168.l.vz.field_0.m128[3] +
                               fVar94 * fVar120 + fVar113 * fVar112 + fVar10 * fVar95 + 0.0;
                      uVar62 = fVar103 * fVar124 +
                               fVar122 * fVar126 + fVar104 * local_168.l.vz.field_0.m128[0];
                      uVar118 = fVar103 * fVar130 +
                                fVar122 * fVar129 + fVar104 * local_168.l.vz.field_0.m128[1];
                      fVar113 = fVar103 * fVar132 +
                                fVar122 * fVar138 + fVar104 * local_168.l.vz.field_0.m128[2];
                      fVar97 = fVar103 * fVar133 +
                               fVar122 * fVar96 + fVar104 * local_168.l.vz.field_0.m128[3];
                    }
                  }
                  else {
                    auVar32._4_4_ = -(uint)((pAVar17->l).vy.field_0.m128[0] != 0.0);
                    auVar32._0_4_ = -(uint)((pAVar17->l).vx.field_0.m128[3] != 0.0);
                    auVar32._8_4_ = -(uint)((pAVar17->l).vy.field_0.m128[1] != 1.0);
                    auVar32._12_4_ = -(uint)((pAVar17->l).vy.field_0.m128[2] != 0.0);
                    uVar75 = movmskps(uVar75,auVar32);
                    if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       (((uVar75 & 4) != 0 ||
                        (bVar69 = ((byte)uVar75 & 8) >> 3,
                        uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))))
                    goto LAB_00165794;
                    auVar33._4_4_ = -(uint)((pAVar17->l).vz.field_0.m128[0] != 0.0);
                    auVar33._0_4_ = -(uint)((pAVar17->l).vy.field_0.m128[3] != 0.0);
                    auVar33._8_4_ = -(uint)((pAVar17->l).vz.field_0.m128[1] != 0.0);
                    auVar33._12_4_ = -(uint)((pAVar17->l).vz.field_0.m128[2] != 1.0);
                    uVar75 = movmskps(uVar75,auVar33);
                    if (((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                        ((uVar75 & 4) != 0)) ||
                       (bVar69 = ((byte)uVar75 & 8) >> 3,
                       uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))
                    goto LAB_00165794;
                    auVar34._4_4_ = -(uint)((pAVar17->p).field_0.m128[0] != 0.0);
                    auVar34._0_4_ = -(uint)((pAVar17->l).vz.field_0.m128[3] != 0.0);
                    auVar34._8_4_ = -(uint)((pAVar17->p).field_0.m128[1] != 0.0);
                    auVar34._12_4_ = -(uint)((pAVar17->p).field_0.m128[2] != 0.0);
                    uVar75 = movmskps(uVar75,auVar34);
                    if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       ((uVar75 & 4) != 0)) goto LAB_00165794;
                    bVar69 = ((byte)uVar75 & 8) >> 3;
                    uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                    uVar70 = (ulong)uVar75;
                    if ((bVar69 != 0) ||
                       ((bVar14 != false &&
                        ((fVar79 = (pAVar17->p).field_0.m128[3], fVar79 != 1.0 || (NAN(fVar79)))))))
                    goto LAB_00165794;
                    pfVar3 = (float *)(lVar18 + -0x30 + lVar74);
                    fVar107 = *pfVar3;
                    local_198 = pfVar3[1];
                    fVar81 = pfVar3[2];
                    fVar79 = pfVar3[3];
                    pfVar3 = (float *)(lVar18 + -0x20 + lVar74);
                    uVar62 = *pfVar3;
                    uVar118 = pfVar3[1];
                    fVar113 = pfVar3[2];
                    fVar97 = pfVar3[3];
                    pfVar3 = (float *)(lVar18 + -0x10 + lVar74);
                    fVar80 = *pfVar3;
                    fVar128 = pfVar3[1];
                    fVar106 = pfVar3[2];
                    fVar111 = pfVar3[3];
                    pfVar3 = (float *)(lVar18 + lVar74);
                    fVar125 = *pfVar3;
                    fVar99 = pfVar3[1];
                    fVar105 = pfVar3[2];
                    fVar94 = pfVar3[3];
                    local_168.l.vy.field_0._8_1_ = bVar61;
                  }
LAB_0016626b:
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x30))->
                                            field_0 + lVar74);
                  *pfVar3 = fVar107;
                  pfVar3[1] = local_198;
                  pfVar3[2] = fVar81;
                  pfVar3[3] = fVar79;
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x20))->
                                            field_0 + lVar74);
                  *pfVar3 = (float)uVar62;
                  pfVar3[1] = (float)uVar118;
                  pfVar3[2] = fVar113;
                  pfVar3[3] = fVar97;
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x10))->
                                            field_0 + lVar74);
                  *pfVar3 = fVar80;
                  pfVar3[1] = fVar128;
                  pfVar3[2] = fVar106;
                  pfVar3[3] = fVar111;
                  pfVar3 = (float *)(local_168.l.vy.field_0._0_8_ + lVar74);
                  *pfVar3 = fVar125;
                  pfVar3[1] = fVar99;
                  pfVar3[2] = fVar105;
                  pfVar3[3] = fVar94;
                  uVar71 = uVar71 + 1;
                  lVar74 = lVar74 + 0x40;
                  uVar65 = local_168.l.vy.field_0._0_8_;
                } while (uVar71 < (ulong)puVar73[2]);
              }
            }
            else if (puVar73[2] == 1) {
              fVar79 = (pTVar2->time_range).lower;
              fVar81 = (pTVar2->time_range).upper;
              fVar97 = (float)*puVar73;
              fVar125 = (float)((ulong)*puVar73 >> 0x20);
              uVar75 = -(uint)(fVar79 < fVar97);
              uVar77 = -(uint)(fVar81 < fVar125);
              local_178._0_8_ =
                   CONCAT44(~uVar77 & (uint)fVar125,~uVar75 & (uint)fVar79) |
                   CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
              local_168.l.vx.field_0._0_8_ = 0;
              local_168.l.vx.field_0._8_8_ = 0;
              local_168.l.vy.field_0._0_8_ =
                   (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
              if (sVar16 != 0) {
                local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar16 << 6,0x10);
                uVar70 = extraout_RDX_16;
                local_168.l.vx.field_0._8_8_ = sVar16;
              }
              uVar65 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
              if (pTVar2->quaternion == false) {
                uVar65 = ZEXT48(*(uint *)(puVar73 + 5));
              }
              local_168.l.vy.field_0._8_1_ = (undefined1)uVar65;
              local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
              if ((pTVar2->spaces).size_active != 0) {
                lVar74 = 0x30;
                uVar71 = 0;
                do {
                  uVar75 = (uint)uVar70;
                  pAVar17 = (pTVar2->spaces).items;
                  pfVar3 = (float *)puVar73[4];
                  bVar14 = pTVar2->quaternion;
                  bVar61 = *(byte *)(puVar73 + 5);
                  local_168.l.vy.field_0._8_1_ = false;
                  fVar79 = *(float *)((long)pAVar17 + lVar74 + -0x30);
                  uVar11 = *(undefined8 *)((long)pAVar17 + lVar74 + -0x2c);
                  fVar81 = (float)((ulong)uVar11 >> 0x20);
                  local_198 = (float)uVar11;
                  if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                      ((NAN(local_198) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_00166476:
                    fVar97 = (float)*(undefined8 *)pfVar3;
                    fVar125 = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20);
                    iVar76 = -(uint)(fVar97 != 1.0);
                    iVar78 = -(uint)(fVar125 != 0.0);
                    auVar91._4_4_ = iVar78;
                    auVar91._0_4_ = iVar76;
                    auVar91._8_4_ = iVar78;
                    auVar91._12_4_ = iVar78;
                    auVar90._8_8_ = auVar91._8_8_;
                    auVar90._4_4_ = iVar76;
                    auVar90._0_4_ = iVar76;
                    uVar75 = movmskpd(uVar75,auVar90);
                    uVar70 = (ulong)uVar75;
                    fVar79 = pfVar3[2];
                    if ((uVar75 & 1) == 0) {
                      bVar69 = (byte)uVar75 >> 1;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                      uVar70 = (ulong)uVar75;
                      if (((bVar69 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                        auVar55._4_4_ = -(uint)(pfVar3[4] != 0.0);
                        auVar55._0_4_ = -(uint)(pfVar3[3] != 0.0);
                        auVar55._8_4_ = -(uint)(pfVar3[5] != 1.0);
                        auVar55._12_4_ = -(uint)(pfVar3[6] != 0.0);
                        uVar75 = movmskps(uVar75,auVar55);
                        uVar70 = (ulong)uVar75;
                        if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                           ((uVar75 & 4) == 0)) {
                          bVar69 = ((byte)uVar75 & 8) >> 3;
                          uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                          uVar70 = (ulong)uVar75;
                          if (bVar69 == 0) {
                            auVar56._4_4_ = -(uint)(pfVar3[8] != 0.0);
                            auVar56._0_4_ = -(uint)(pfVar3[7] != 0.0);
                            auVar56._8_4_ = -(uint)(pfVar3[9] != 0.0);
                            auVar56._12_4_ = -(uint)(pfVar3[10] != 1.0);
                            uVar75 = movmskps(uVar75,auVar56);
                            uVar70 = (ulong)uVar75;
                            if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                               ((uVar75 & 4) == 0)) {
                              bVar69 = ((byte)uVar75 & 8) >> 3;
                              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                              uVar70 = (ulong)uVar75;
                              if (bVar69 == 0) {
                                auVar57._4_4_ = -(uint)(pfVar3[0xc] != 0.0);
                                auVar57._0_4_ = -(uint)(pfVar3[0xb] != 0.0);
                                auVar57._8_4_ = -(uint)(pfVar3[0xd] != 0.0);
                                auVar57._12_4_ = -(uint)(pfVar3[0xe] != 0.0);
                                uVar75 = movmskps(uVar75,auVar57);
                                uVar70 = (ulong)uVar75;
                                if (((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                                    ((uVar75 & 4) == 0)) &&
                                   ((bVar69 = ((byte)uVar75 & 8) >> 3,
                                    uVar70 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar69),
                                    bVar69 == 0 &&
                                    ((bVar61 == 0 || ((pfVar3[0xf] == 1.0 && (!NAN(pfVar3[0xf]))))))
                                    ))) {
                                  pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x30);
                                  fVar107 = *pfVar3;
                                  local_198 = pfVar3[1];
                                  fVar81 = pfVar3[2];
                                  fVar79 = pfVar3[3];
                                  pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x20);
                                  uVar62 = *pfVar3;
                                  uVar118 = pfVar3[1];
                                  fVar113 = pfVar3[2];
                                  fVar97 = pfVar3[3];
                                  pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x10);
                                  fVar80 = *pfVar3;
                                  fVar128 = pfVar3[1];
                                  fVar106 = pfVar3[2];
                                  fVar111 = pfVar3[3];
                                  pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                                  fVar125 = *pfVar3;
                                  fVar99 = pfVar3[1];
                                  fVar105 = pfVar3[2];
                                  fVar94 = pfVar3[3];
                                  local_168.l.vy.field_0._8_1_ = bVar14;
                                  goto LAB_00166f4a;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if ((bVar14 == false) && (bVar61 == 0)) {
                      pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x30);
                      fVar129 = *pfVar4;
                      fVar135 = pfVar4[1];
                      fVar138 = pfVar4[2];
                      fVar95 = pfVar4[3];
                      pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x20);
                      fVar96 = *pfVar4;
                      fVar100 = pfVar4[1];
                      fVar131 = pfVar4[2];
                      fVar101 = pfVar4[3];
                      pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x10);
                      fVar102 = *pfVar4;
                      fVar136 = pfVar4[1];
                      fVar103 = pfVar4[2];
                      fVar137 = pfVar4[3];
                      fVar107 = fVar97 * fVar129 + fVar125 * fVar96 + fVar79 * fVar102;
                      local_198 = fVar97 * fVar135 + fVar125 * fVar100 + fVar79 * fVar136;
                      fVar81 = fVar97 * fVar138 + fVar125 * fVar131 + fVar79 * fVar103;
                      fVar10 = pfVar3[4];
                      fVar98 = pfVar3[5];
                      fVar126 = pfVar3[6];
                      fVar111 = pfVar3[8];
                      fVar99 = pfVar3[9];
                      fVar105 = pfVar3[10];
                      fVar80 = fVar111 * fVar129 + fVar99 * fVar96 + fVar105 * fVar102;
                      fVar128 = fVar111 * fVar135 + fVar99 * fVar100 + fVar105 * fVar136;
                      fVar106 = fVar111 * fVar138 + fVar99 * fVar131 + fVar105 * fVar103;
                      fVar94 = pfVar3[0xc];
                      fVar113 = pfVar3[0xd];
                      fVar127 = pfVar3[0xe];
                      pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                      fVar111 = fVar111 * fVar95 + fVar99 * fVar101 + fVar105 * fVar137;
                      fVar79 = fVar97 * fVar95 + fVar125 * fVar101 + fVar79 * fVar137;
                      fVar125 = fVar94 * fVar129 + fVar113 * fVar96 + fVar127 * fVar102 + *pfVar3;
                      fVar99 = fVar94 * fVar135 + fVar113 * fVar100 + fVar127 * fVar136 + pfVar3[1];
                      fVar105 = fVar94 * fVar138 + fVar113 * fVar131 + fVar127 * fVar103 + pfVar3[2]
                      ;
                      fVar94 = fVar94 * fVar95 + fVar113 * fVar101 + fVar127 * fVar137 + pfVar3[3];
                      uVar62 = fVar10 * fVar129 + fVar98 * fVar96 + fVar126 * fVar102;
                      uVar118 = fVar10 * fVar135 + fVar98 * fVar100 + fVar126 * fVar136;
                      fVar113 = fVar10 * fVar138 + fVar98 * fVar131 + fVar126 * fVar103;
                      fVar97 = fVar10 * fVar95 + fVar98 * fVar101 + fVar126 * fVar137;
                    }
                    else if ((bVar14 == false) || (bVar61 == 0)) {
                      if ((bVar14 == false) || (bVar61 != 0)) {
                        if ((local_198 != 0.0) ||
                           ((((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))) ||
                            (uVar11 = *(undefined8 *)((long)pAVar17 + lVar74 + -0x10),
                            auVar39._4_4_ =
                                 -(uint)(*(float *)((long)pAVar17 + lVar74 + -0x20) != 0.0),
                            auVar39._0_4_ =
                                 -(uint)(*(float *)((long)pAVar17 + lVar74 + -0x18) != 0.0),
                            auVar39._8_4_ = -(uint)((float)uVar11 != 0.0),
                            auVar39._12_4_ = -(uint)((float)((ulong)uVar11 >> 0x20) != 0.0),
                            uVar62 = movmskps((int)CONCAT71((int7)((ulong)uVar65 >> 8),bVar61),
                                              auVar39), (char)uVar62 != '\0')))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_19;
                        }
                        fVar79 = pfVar3[3];
                        uVar62 = pfVar3[4];
                        fVar97 = pfVar3[7];
                        fVar80 = pfVar3[8];
                        fVar128 = pfVar3[9];
                        fVar111 = pfVar3[0xb];
                        fVar125 = pfVar3[0xc];
                        fVar99 = pfVar3[0xd];
                        fVar105 = pfVar3[0xe];
                        fVar94 = pfVar3[0xf];
                        uVar65 = *(undefined8 *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                        fVar107 = *(float *)((long)pAVar17 + lVar74 + -0x30) * *pfVar3;
                        local_198 = pfVar3[1] + (float)uVar65;
                        fVar81 = pfVar3[2] + (float)((ulong)uVar65 >> 0x20);
                        fVar113 = pfVar3[6] +
                                  *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 8);
                        uVar118 = pfVar3[5] * *(float *)((long)pAVar17 + lVar74 + -0x1c);
                        fVar106 = pfVar3[10] * *(float *)((long)pAVar17 + lVar74 + -8);
                        local_168.l.vy.field_0._8_1_ = true;
                      }
                      else {
                        local_e8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                    )ZEXT416(*(uint *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc
                                                      ));
                        local_c8 = ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -0x24));
                        _local_b8 = ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -0x14));
                        local_f8 = ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -4));
                        paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                  *)((long)pAVar17 + lVar74 + -0x20);
                        local_118 = paVar8->x;
                        fStack_114 = paVar8->y;
                        fStack_10c = (paVar8->field_3).w;
                        local_d8 = *paVar8;
                        paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                  *)((long)pAVar17 + lVar74 + -0x10);
                        fVar97 = paVar8->x;
                        fVar125 = paVar8->y;
                        fVar80 = paVar8->z;
                        local_108 = *paVar8;
                        pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x30);
                        fVar79 = *pfVar4;
                        fStack_5c = pfVar4[1];
                        fVar128 = *pfVar3;
                        fVar111 = pfVar3[1];
                        fVar99 = pfVar3[2];
                        fVar105 = pfVar3[4];
                        fVar94 = pfVar3[5];
                        fVar113 = pfVar3[6];
                        local_128 = *(undefined8 *)(pfVar3 + 8);
                        lStack_120 = *(long *)(pfVar3 + 10);
                        fVar106 = pfVar3[0xc];
                        fVar10 = pfVar3[0xd];
                        fVar98 = pfVar3[0xe];
                        fVar107 = fVar128 * fVar79 + fVar111 * local_118 + fVar99 * fVar97;
                        fVar126 = fVar128 * 0.0 + fVar111 * fStack_114 + fVar99 * fVar125;
                        fVar128 = fVar128 * 0.0 + fVar111 * 0.0 + fVar99 * fVar80;
                        local_168.l.vz.field_0.m128[0] =
                             fVar105 * fVar79 + fVar94 * local_118 + fVar113 * fVar97;
                        local_168.l.vz.field_0.m128[1] =
                             fVar105 * 0.0 + fVar94 * fStack_114 + fVar113 * fVar125;
                        local_168.l.vz.field_0.m128[2] =
                             fVar105 * 0.0 + fVar94 * 0.0 + fVar113 * fVar80;
                        local_168.l.vz.field_0.m128[3] =
                             fVar105 * fStack_5c +
                             fVar94 * fStack_10c + fVar113 * (paVar8->field_3).w;
                        fStack_110 = 0.0;
                        local_68 = (ulong)(uint)fVar79;
                        fStack_60 = 0.0;
                        pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                        local_a8._0_4_ =
                             fVar106 * fVar79 + fVar10 * local_118 + fVar98 * fVar97 + *pfVar3;
                        local_a8._4_4_ =
                             fVar106 * 0.0 + fVar10 * fStack_114 + fVar98 * fVar125 + pfVar3[1];
                        fStack_a0 = fVar106 * 0.0 + fVar10 * 0.0 + fVar98 * fVar80 + pfVar3[2];
                        fStack_9c = fVar106 * fStack_5c +
                                    fVar10 * fStack_10c + fVar98 * (paVar8->field_3).w + pfVar3[3];
                        if ((((fVar126 != 0.0) || (NAN(fVar126))) ||
                            ((fVar128 != 0.0 ||
                             ((NAN(fVar128) || (local_168.l.vz.field_0.m128[2] != 0.0)))))) ||
                           (NAN(local_168.l.vz.field_0.m128[2]))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_18;
                        }
                        fVar80 = (float)local_68 * (float)local_128 +
                                 local_118 * local_128._4_4_ + local_108.x * (float)lStack_120;
                        fVar128 = local_68._4_4_ * (float)local_128 +
                                  fStack_114 * local_128._4_4_ + local_108.y * (float)lStack_120;
                        fVar106 = fStack_60 * (float)local_128 +
                                  fStack_110 * local_128._4_4_ + local_108.z * (float)lStack_120;
                        local_168.l.vy.field_0._8_1_ = true;
                        fVar111 = (float)local_f8._0_4_;
                        fVar79 = (float)local_c8._0_4_;
                        fVar125 = (float)local_a8._0_4_;
                        fVar99 = (float)local_a8._4_4_;
                        fVar105 = fStack_a0;
                        fVar94 = local_e8.x;
                        uVar62 = local_168.l.vz.field_0.m128[0];
                        uVar118 = local_168.l.vz.field_0.m128[1];
                        fVar113 = local_d8.z;
                        fVar97 = (float)local_b8._0_4_;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                      std::ostream::put(-0x38);
                      std::ostream::flush();
                      fVar79 = *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc);
                      fVar81 = *(float *)((long)pAVar17 + lVar74 + -0x24);
                      fVar97 = *(float *)((long)pAVar17 + lVar74 + -0x14);
                      fVar125 = *(float *)((long)pAVar17 + lVar74 + -4);
                      auVar13 = *(undefined1 (*) [16])((long)pAVar17 + lVar74 + -0x30);
                      pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x20);
                      fVar80 = *pfVar4;
                      fVar128 = pfVar4[1];
                      pfVar5 = (float *)((long)pAVar17 + lVar74 + -0x10);
                      fVar111 = *pfVar5;
                      fVar99 = pfVar5[1];
                      fVar105 = pfVar5[2];
                      fVar129 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar106 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar98 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                               -fVar125 * fVar125;
                      fVar126 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar127 = fVar97 * fVar97 + fVar126 + -fVar125 * fVar125;
                      fVar138 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar107 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar135 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar79 = fVar97 * fVar125 - fVar79 * fVar81;
                      pfVar5 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                      fVar94 = *pfVar5;
                      fVar113 = pfVar5[1];
                      fVar10 = pfVar5[2];
                      fVar129 = fVar129 + fVar129;
                      fVar138 = fVar138 + fVar138;
                      fVar106 = fVar106 + fVar106;
                      fVar135 = fVar135 + fVar135;
                      fVar107 = fVar107 + fVar107;
                      fVar79 = fVar79 + fVar79;
                      fVar81 = fVar125 * fVar125 + fVar126 + -fVar97 * fVar97;
                      fVar114 = fVar98 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar116 = fVar98 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                      fVar119 = fVar98 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                      fVar120 = fVar98 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar108 = fVar106 * 1.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar109 = fVar106 * 0.0 + fVar127 * 1.0 + fVar135 * 0.0;
                      fVar110 = fVar106 * 0.0 + fVar127 * 0.0 + fVar135 * 1.0;
                      fVar112 = fVar106 * 0.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar98 = fVar107 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      fVar127 = fVar107 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                      fVar135 = fVar107 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                      fVar95 = fVar107 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      local_188 = auVar13._4_4_;
                      fStack_184 = auVar13._8_4_;
                      local_198 = auVar13._0_4_;
                      fVar124 = local_198 * fVar114 + fVar108 * 0.0 + fVar98 * 0.0;
                      fVar130 = local_198 * fVar116 + fVar109 * 0.0 + fVar127 * 0.0;
                      fVar132 = local_198 * fVar119 + fVar110 * 0.0 + fVar135 * 0.0;
                      fVar133 = local_198 * fVar120 + fVar112 * 0.0 + fVar95 * 0.0;
                      fVar126 = fVar80 * fVar114 + fVar128 * fVar108 + fVar98 * 0.0;
                      fVar129 = fVar80 * fVar116 + fVar128 * fVar109 + fVar127 * 0.0;
                      fVar138 = fVar80 * fVar119 + fVar128 * fVar110 + fVar135 * 0.0;
                      fVar96 = fVar80 * fVar120 + fVar128 * fVar112 + fVar95 * 0.0;
                      local_168.l.vz.field_0.m128[0] =
                           fVar111 * fVar114 + fVar99 * fVar108 + fVar105 * fVar98;
                      local_168.l.vz.field_0.m128[1] =
                           fVar111 * fVar116 + fVar99 * fVar109 + fVar105 * fVar127;
                      local_168.l.vz.field_0.m128[2] =
                           fVar111 * fVar119 + fVar99 * fVar110 + fVar105 * fVar135;
                      local_168.l.vz.field_0.m128[3] =
                           fVar111 * fVar120 + fVar99 * fVar112 + fVar105 * fVar95;
                      fVar79 = pfVar3[0xf];
                      fVar81 = pfVar3[3];
                      fVar97 = pfVar3[7];
                      fVar125 = pfVar3[0xb];
                      fVar131 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar106 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar100 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                                -fVar125 * fVar125;
                      fVar128 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar137 = fVar97 * fVar97 + fVar128 + -fVar125 * fVar125;
                      fVar136 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar103 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar139 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar107 = fVar97 * fVar125 - fVar79 * fVar81;
                      fVar79 = *pfVar3;
                      fVar81 = pfVar3[4];
                      fVar80 = pfVar3[5];
                      fVar122 = fVar125 * fVar125 + fVar128 + -fVar97 * fVar97;
                      fVar97 = pfVar3[8];
                      fVar125 = pfVar3[9];
                      fVar128 = pfVar3[10];
                      fVar131 = fVar131 + fVar131;
                      fVar136 = fVar136 + fVar136;
                      fVar111 = pfVar3[0xc];
                      fVar99 = pfVar3[0xd];
                      fVar105 = pfVar3[0xe];
                      fVar101 = fVar100 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                      fVar102 = fVar100 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                      fVar136 = fVar100 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                      fVar106 = fVar106 + fVar106;
                      fVar139 = fVar139 + fVar139;
                      fVar103 = fVar103 + fVar103;
                      fVar107 = fVar107 + fVar107;
                      fVar100 = fVar106 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                      fVar131 = fVar106 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                      fVar106 = fVar106 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                      fVar137 = fVar103 * 1.0 + fVar107 * 0.0 + fVar122 * 0.0;
                      fVar139 = fVar103 * 0.0 + fVar107 * 1.0 + fVar122 * 0.0;
                      fVar107 = fVar103 * 0.0 + fVar107 * 0.0 + fVar122 * 1.0;
                      fVar115 = fVar79 * fVar101 + fVar100 * 0.0 + fVar137 * 0.0;
                      fVar117 = fVar79 * fVar102 + fVar131 * 0.0 + fVar139 * 0.0;
                      fVar79 = fVar79 * fVar136 + fVar106 * 0.0 + fVar107 * 0.0;
                      fVar103 = fVar81 * fVar101 + fVar80 * fVar100 + fVar137 * 0.0;
                      fVar122 = fVar81 * fVar102 + fVar80 * fVar131 + fVar139 * 0.0;
                      fVar104 = fVar81 * fVar136 + fVar80 * fVar106 + fVar107 * 0.0;
                      fVar121 = fVar97 * fVar101 + fVar125 * fVar100 + fVar128 * fVar137;
                      fVar123 = fVar97 * fVar102 + fVar125 * fVar131 + fVar128 * fVar139;
                      fVar125 = fVar97 * fVar136 + fVar125 * fVar106 + fVar128 * fVar107;
                      fVar97 = fVar111 * fVar101 + fVar99 * fVar100 + fVar105 * fVar137 +
                               pfVar3[1] + 0.0;
                      fVar100 = fVar111 * fVar102 + fVar99 * fVar131 + fVar105 * fVar139 +
                                pfVar3[2] + 0.0;
                      fVar131 = fVar111 * fVar136 + fVar99 * fVar106 + fVar105 * fVar107 +
                                pfVar3[6] + 0.0;
                      fVar107 = fVar115 * fVar124 +
                                fVar117 * fVar126 + fVar79 * local_168.l.vz.field_0.m128[0];
                      local_198 = fVar115 * fVar130 +
                                  fVar117 * fVar129 + fVar79 * local_168.l.vz.field_0.m128[1];
                      fVar81 = fVar115 * fVar132 +
                               fVar117 * fVar138 + fVar79 * local_168.l.vz.field_0.m128[2];
                      fVar80 = fVar121 * fVar124 +
                               fVar123 * fVar126 + fVar125 * local_168.l.vz.field_0.m128[0];
                      fVar128 = fVar121 * fVar130 +
                                fVar123 * fVar129 + fVar125 * local_168.l.vz.field_0.m128[1];
                      fVar106 = fVar121 * fVar132 +
                                fVar123 * fVar138 + fVar125 * local_168.l.vz.field_0.m128[2];
                      uVar70 = extraout_RDX_17;
                      fVar111 = fVar121 * fVar133 +
                                fVar123 * fVar96 + fVar125 * local_168.l.vz.field_0.m128[3];
                      fVar79 = fVar115 * fVar133 +
                               fVar117 * fVar96 + fVar79 * local_168.l.vz.field_0.m128[3];
                      fVar125 = fVar97 * fVar124 +
                                fVar100 * fVar126 + fVar131 * local_168.l.vz.field_0.m128[0] +
                                fVar94 * fVar114 + fVar113 * fVar108 + fVar10 * fVar98 +
                                local_188 + 0.0;
                      fVar99 = fVar97 * fVar130 +
                               fVar100 * fVar129 + fVar131 * local_168.l.vz.field_0.m128[1] +
                               fVar94 * fVar116 + fVar113 * fVar109 + fVar10 * fVar127 +
                               fStack_184 + 0.0;
                      fVar105 = fVar97 * fVar132 +
                                fVar100 * fVar138 + fVar131 * local_168.l.vz.field_0.m128[2] +
                                fVar94 * fVar119 + fVar113 * fVar110 + fVar10 * fVar135 +
                                pfVar4[2] + 0.0;
                      fVar94 = fVar97 * fVar133 +
                               fVar100 * fVar96 + fVar131 * local_168.l.vz.field_0.m128[3] +
                               fVar94 * fVar120 + fVar113 * fVar112 + fVar10 * fVar95 + 0.0;
                      uVar62 = fVar103 * fVar124 +
                               fVar122 * fVar126 + fVar104 * local_168.l.vz.field_0.m128[0];
                      uVar118 = fVar103 * fVar130 +
                                fVar122 * fVar129 + fVar104 * local_168.l.vz.field_0.m128[1];
                      fVar113 = fVar103 * fVar132 +
                                fVar122 * fVar138 + fVar104 * local_168.l.vz.field_0.m128[2];
                      fVar97 = fVar103 * fVar133 +
                               fVar122 * fVar96 + fVar104 * local_168.l.vz.field_0.m128[3];
                    }
                  }
                  else {
                    pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x24);
                    auVar36._4_4_ = -(uint)(pfVar4[1] != 0.0);
                    auVar36._0_4_ = -(uint)(*pfVar4 != 0.0);
                    auVar36._8_4_ = -(uint)(pfVar4[2] != 1.0);
                    auVar36._12_4_ = -(uint)(pfVar4[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar36);
                    if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       (((uVar75 & 4) != 0 ||
                        (bVar69 = ((byte)uVar75 & 8) >> 3,
                        uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))))
                    goto LAB_00166476;
                    pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x14);
                    auVar37._4_4_ = -(uint)(pfVar4[1] != 0.0);
                    auVar37._0_4_ = -(uint)(*pfVar4 != 0.0);
                    auVar37._8_4_ = -(uint)(pfVar4[2] != 0.0);
                    auVar37._12_4_ = -(uint)(pfVar4[3] != 1.0);
                    uVar75 = movmskps(uVar75,auVar37);
                    if (((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                        ((uVar75 & 4) != 0)) ||
                       (bVar69 = ((byte)uVar75 & 8) >> 3,
                       uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))
                    goto LAB_00166476;
                    pfVar4 = (float *)((long)pAVar17 + lVar74 + -4);
                    auVar38._4_4_ = -(uint)(pfVar4[1] != 0.0);
                    auVar38._0_4_ = -(uint)(*pfVar4 != 0.0);
                    auVar38._8_4_ = -(uint)(pfVar4[2] != 0.0);
                    auVar38._12_4_ = -(uint)(pfVar4[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar38);
                    if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       ((uVar75 & 4) != 0)) goto LAB_00166476;
                    bVar69 = ((byte)uVar75 & 8) >> 3;
                    uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                    uVar70 = (ulong)uVar75;
                    if ((bVar69 != 0) ||
                       ((bVar14 != false &&
                        ((fVar79 = *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc),
                         fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_00166476;
                    fVar107 = *pfVar3;
                    local_198 = pfVar3[1];
                    fVar81 = pfVar3[2];
                    fVar79 = pfVar3[3];
                    uVar62 = pfVar3[4];
                    uVar118 = pfVar3[5];
                    fVar113 = pfVar3[6];
                    fVar97 = pfVar3[7];
                    fVar80 = pfVar3[8];
                    fVar128 = pfVar3[9];
                    fVar106 = pfVar3[10];
                    fVar111 = pfVar3[0xb];
                    fVar125 = pfVar3[0xc];
                    fVar99 = pfVar3[0xd];
                    fVar105 = pfVar3[0xe];
                    fVar94 = pfVar3[0xf];
                    local_168.l.vy.field_0._8_1_ = bVar61;
                  }
LAB_00166f4a:
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x30))->
                                            field_0 + lVar74);
                  *pfVar3 = fVar107;
                  pfVar3[1] = local_198;
                  pfVar3[2] = fVar81;
                  pfVar3[3] = fVar79;
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x20))->
                                            field_0 + lVar74);
                  *pfVar3 = (float)uVar62;
                  pfVar3[1] = (float)uVar118;
                  pfVar3[2] = fVar113;
                  pfVar3[3] = fVar97;
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x10))->
                                            field_0 + lVar74);
                  *pfVar3 = fVar80;
                  pfVar3[1] = fVar128;
                  pfVar3[2] = fVar106;
                  pfVar3[3] = fVar111;
                  pfVar3 = (float *)(local_168.l.vy.field_0._0_8_ + lVar74);
                  *pfVar3 = fVar125;
                  pfVar3[1] = fVar99;
                  pfVar3[2] = fVar105;
                  pfVar3[3] = fVar94;
                  uVar71 = uVar71 + 1;
                  lVar74 = lVar74 + 0x40;
                  uVar65 = local_168.l.vy.field_0._0_8_;
                } while (uVar71 < (pTVar2->spaces).size_active);
              }
            }
            else {
              if (sVar16 != puVar73[2]) {
                prVar67 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar67,"number of transformations does not match");
                __cxa_throw(prVar67,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              fVar79 = (pTVar2->time_range).lower;
              fVar81 = (pTVar2->time_range).upper;
              fVar97 = (float)*puVar73;
              fVar125 = (float)((ulong)*puVar73 >> 0x20);
              uVar75 = -(uint)(fVar79 < fVar97);
              uVar77 = -(uint)(fVar81 < fVar125);
              local_178._0_8_ =
                   CONCAT44(~uVar77 & (uint)fVar125,~uVar75 & (uint)fVar79) |
                   CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
              local_168.l.vx.field_0._0_8_ = 0;
              local_168.l.vx.field_0._8_8_ = 0;
              local_168.l.vy.field_0._0_8_ =
                   (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
              if (sVar16 != 0) {
                local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar16 << 6,0x10);
                uVar70 = extraout_RDX_20;
                local_168.l.vx.field_0._8_8_ = sVar16;
              }
              uVar65 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
              if (pTVar2->quaternion == false) {
                uVar65 = ZEXT48(*(uint *)(puVar73 + 5));
              }
              local_168.l.vy.field_0._8_1_ = (undefined1)uVar65;
              local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
              if ((pTVar2->spaces).size_active != 0) {
                lVar74 = 0x30;
                uVar71 = 0;
                do {
                  uVar75 = (uint)uVar70;
                  pAVar17 = (pTVar2->spaces).items;
                  lVar18 = puVar73[4];
                  bVar14 = pTVar2->quaternion;
                  bVar61 = *(byte *)(puVar73 + 5);
                  local_168.l.vy.field_0._8_1_ = false;
                  fVar79 = *(float *)((long)pAVar17 + lVar74 + -0x30);
                  uVar11 = *(undefined8 *)((long)pAVar17 + lVar74 + -0x2c);
                  fVar81 = (float)((ulong)uVar11 >> 0x20);
                  local_198 = (float)uVar11;
                  if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                      ((NAN(local_198) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_0016714e:
                    uVar11 = *(undefined8 *)(lVar18 + -0x30 + lVar74);
                    fVar97 = (float)uVar11;
                    fVar125 = (float)((ulong)uVar11 >> 0x20);
                    iVar76 = -(uint)(fVar97 != 1.0);
                    iVar78 = -(uint)(fVar125 != 0.0);
                    auVar93._4_4_ = iVar78;
                    auVar93._0_4_ = iVar76;
                    auVar93._8_4_ = iVar78;
                    auVar93._12_4_ = iVar78;
                    auVar92._8_8_ = auVar93._8_8_;
                    auVar92._4_4_ = iVar76;
                    auVar92._0_4_ = iVar76;
                    uVar75 = movmskpd(uVar75,auVar92);
                    uVar70 = (ulong)uVar75;
                    fVar79 = *(float *)(lVar18 + -0x28 + lVar74);
                    if ((uVar75 & 1) == 0) {
                      bVar69 = (byte)uVar75 >> 1;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                      uVar70 = (ulong)uVar75;
                      if (((bVar69 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                        pfVar3 = (float *)(lVar18 + -0x24 + lVar74);
                        auVar58._4_4_ = -(uint)(pfVar3[1] != 0.0);
                        auVar58._0_4_ = -(uint)(*pfVar3 != 0.0);
                        auVar58._8_4_ = -(uint)(pfVar3[2] != 1.0);
                        auVar58._12_4_ = -(uint)(pfVar3[3] != 0.0);
                        uVar75 = movmskps(uVar75,auVar58);
                        uVar70 = (ulong)uVar75;
                        if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                           ((uVar75 & 4) == 0)) {
                          bVar69 = ((byte)uVar75 & 8) >> 3;
                          uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                          uVar70 = (ulong)uVar75;
                          if (bVar69 == 0) {
                            pfVar3 = (float *)(lVar18 + -0x14 + lVar74);
                            auVar59._4_4_ = -(uint)(pfVar3[1] != 0.0);
                            auVar59._0_4_ = -(uint)(*pfVar3 != 0.0);
                            auVar59._8_4_ = -(uint)(pfVar3[2] != 0.0);
                            auVar59._12_4_ = -(uint)(pfVar3[3] != 1.0);
                            uVar75 = movmskps(uVar75,auVar59);
                            uVar70 = (ulong)uVar75;
                            if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                               ((uVar75 & 4) == 0)) {
                              bVar69 = ((byte)uVar75 & 8) >> 3;
                              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                              uVar70 = (ulong)uVar75;
                              if (bVar69 == 0) {
                                pfVar3 = (float *)(lVar18 + -4 + lVar74);
                                auVar60._4_4_ = -(uint)(pfVar3[1] != 0.0);
                                auVar60._0_4_ = -(uint)(*pfVar3 != 0.0);
                                auVar60._8_4_ = -(uint)(pfVar3[2] != 0.0);
                                auVar60._12_4_ = -(uint)(pfVar3[3] != 0.0);
                                uVar75 = movmskps(uVar75,auVar60);
                                uVar70 = (ulong)uVar75;
                                if ((((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                                     ((uVar75 & 4) == 0)) &&
                                    (bVar69 = ((byte)uVar75 & 8) >> 3,
                                    uVar70 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar69),
                                    bVar69 == 0)) &&
                                   ((bVar61 == 0 ||
                                    ((fVar80 = *(float *)(lVar18 + 0xc + lVar74), fVar80 == 1.0 &&
                                     (!NAN(fVar80))))))) {
                                  pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x30);
                                  fVar107 = *pfVar3;
                                  local_198 = pfVar3[1];
                                  fVar81 = pfVar3[2];
                                  fVar79 = pfVar3[3];
                                  pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x20);
                                  uVar62 = *pfVar3;
                                  uVar118 = pfVar3[1];
                                  fVar113 = pfVar3[2];
                                  fVar97 = pfVar3[3];
                                  pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x10);
                                  fVar80 = *pfVar3;
                                  fVar128 = pfVar3[1];
                                  fVar106 = pfVar3[2];
                                  fVar111 = pfVar3[3];
                                  pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                                  fVar125 = *pfVar3;
                                  fVar99 = pfVar3[1];
                                  fVar105 = pfVar3[2];
                                  fVar94 = pfVar3[3];
                                  local_168.l.vy.field_0._8_1_ = bVar14;
                                  goto LAB_00167c45;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if ((bVar14 == false) && (bVar61 == 0)) {
                      pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x30);
                      fVar129 = *pfVar3;
                      fVar135 = pfVar3[1];
                      fVar138 = pfVar3[2];
                      fVar95 = pfVar3[3];
                      pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x20);
                      fVar96 = *pfVar3;
                      fVar100 = pfVar3[1];
                      fVar131 = pfVar3[2];
                      fVar101 = pfVar3[3];
                      pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x10);
                      fVar102 = *pfVar3;
                      fVar136 = pfVar3[1];
                      fVar103 = pfVar3[2];
                      fVar137 = pfVar3[3];
                      fVar107 = fVar97 * fVar129 + fVar125 * fVar96 + fVar79 * fVar102;
                      local_198 = fVar97 * fVar135 + fVar125 * fVar100 + fVar79 * fVar136;
                      fVar81 = fVar97 * fVar138 + fVar125 * fVar131 + fVar79 * fVar103;
                      fVar10 = *(float *)(lVar18 + -0x20 + lVar74);
                      fVar98 = *(float *)(lVar18 + -0x1c + lVar74);
                      fVar126 = *(float *)(lVar18 + -0x18 + lVar74);
                      fVar111 = *(float *)(lVar18 + -0x10 + lVar74);
                      fVar99 = *(float *)(lVar18 + -0xc + lVar74);
                      fVar105 = *(float *)(lVar18 + -8 + lVar74);
                      fVar80 = fVar111 * fVar129 + fVar99 * fVar96 + fVar105 * fVar102;
                      fVar128 = fVar111 * fVar135 + fVar99 * fVar100 + fVar105 * fVar136;
                      fVar106 = fVar111 * fVar138 + fVar99 * fVar131 + fVar105 * fVar103;
                      fVar94 = *(float *)(lVar18 + lVar74);
                      fVar113 = *(float *)(lVar18 + 4 + lVar74);
                      fVar127 = *(float *)(lVar18 + 8 + lVar74);
                      pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                      fVar111 = fVar111 * fVar95 + fVar99 * fVar101 + fVar105 * fVar137;
                      fVar79 = fVar97 * fVar95 + fVar125 * fVar101 + fVar79 * fVar137;
                      fVar125 = fVar94 * fVar129 + fVar113 * fVar96 + fVar127 * fVar102 + *pfVar3;
                      fVar99 = fVar94 * fVar135 + fVar113 * fVar100 + fVar127 * fVar136 + pfVar3[1];
                      fVar105 = fVar94 * fVar138 + fVar113 * fVar131 + fVar127 * fVar103 + pfVar3[2]
                      ;
                      fVar94 = fVar94 * fVar95 + fVar113 * fVar101 + fVar127 * fVar137 + pfVar3[3];
                      uVar62 = fVar10 * fVar129 + fVar98 * fVar96 + fVar126 * fVar102;
                      uVar118 = fVar10 * fVar135 + fVar98 * fVar100 + fVar126 * fVar136;
                      fVar113 = fVar10 * fVar138 + fVar98 * fVar131 + fVar126 * fVar103;
                      fVar97 = fVar10 * fVar95 + fVar98 * fVar101 + fVar126 * fVar137;
                    }
                    else if ((bVar14 == false) || (bVar61 == 0)) {
                      if ((bVar14 == false) || (bVar61 != 0)) {
                        if (((local_198 != 0.0) ||
                            (((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))))) ||
                           (uVar11 = *(undefined8 *)((long)pAVar17 + lVar74 + -0x10),
                           auVar42._4_4_ =
                                -(uint)(*(float *)((long)pAVar17 + lVar74 + -0x20) != 0.0),
                           auVar42._0_4_ =
                                -(uint)(*(float *)((long)pAVar17 + lVar74 + -0x18) != 0.0),
                           auVar42._8_4_ = -(uint)((float)uVar11 != 0.0),
                           auVar42._12_4_ = -(uint)((float)((ulong)uVar11 >> 0x20) != 0.0),
                           uVar62 = movmskps((int)CONCAT71((int7)((ulong)uVar65 >> 8),bVar61),
                                             auVar42), (char)uVar62 != '\0')) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_23;
                        }
                        pfVar4 = (float *)(lVar18 + -0x30 + lVar74);
                        fVar79 = pfVar4[3];
                        pfVar5 = (float *)(lVar18 + -0x20 + lVar74);
                        uVar62 = *pfVar5;
                        fVar97 = pfVar5[3];
                        pfVar6 = (float *)(lVar18 + -0x10 + lVar74);
                        fVar80 = *pfVar6;
                        fVar128 = pfVar6[1];
                        fVar111 = pfVar6[3];
                        pfVar3 = (float *)(lVar18 + lVar74);
                        fVar125 = *pfVar3;
                        fVar99 = pfVar3[1];
                        fVar105 = pfVar3[2];
                        fVar94 = pfVar3[3];
                        uVar65 = *(undefined8 *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                        fVar107 = *(float *)((long)pAVar17 + lVar74 + -0x30) * *pfVar4;
                        local_198 = pfVar4[1] + (float)uVar65;
                        fVar81 = pfVar4[2] + (float)((ulong)uVar65 >> 0x20);
                        fVar113 = pfVar5[2] +
                                  *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 8);
                        uVar118 = pfVar5[1] * *(float *)((long)pAVar17 + lVar74 + -0x1c);
                        fVar106 = pfVar6[2] * *(float *)((long)pAVar17 + lVar74 + -8);
                        local_168.l.vy.field_0._8_1_ = true;
                      }
                      else {
                        local_e8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                    )ZEXT416(*(uint *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc
                                                      ));
                        local_c8 = ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -0x24));
                        _local_b8 = ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -0x14));
                        local_f8 = ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -4));
                        paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                  *)((long)pAVar17 + lVar74 + -0x20);
                        local_118 = paVar8->x;
                        fStack_114 = paVar8->y;
                        fStack_10c = (paVar8->field_3).w;
                        local_d8 = *paVar8;
                        paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                  *)((long)pAVar17 + lVar74 + -0x10);
                        fVar97 = paVar8->x;
                        fVar125 = paVar8->y;
                        fVar80 = paVar8->z;
                        local_108 = *paVar8;
                        pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x30);
                        fVar79 = *pfVar3;
                        fStack_5c = pfVar3[1];
                        pfVar3 = (float *)(lVar18 + -0x30 + lVar74);
                        fVar128 = *pfVar3;
                        fVar111 = pfVar3[1];
                        fVar99 = pfVar3[2];
                        pfVar3 = (float *)(lVar18 + -0x20 + lVar74);
                        fVar105 = *pfVar3;
                        fVar94 = pfVar3[1];
                        fVar113 = pfVar3[2];
                        puVar9 = (undefined8 *)(lVar18 + -0x10 + lVar74);
                        local_128 = *puVar9;
                        lStack_120 = puVar9[1];
                        pfVar3 = (float *)(lVar18 + lVar74);
                        fVar106 = *pfVar3;
                        fVar10 = pfVar3[1];
                        fVar98 = pfVar3[2];
                        fVar107 = fVar128 * fVar79 + fVar111 * local_118 + fVar99 * fVar97;
                        fVar126 = fVar128 * 0.0 + fVar111 * fStack_114 + fVar99 * fVar125;
                        fVar128 = fVar128 * 0.0 + fVar111 * 0.0 + fVar99 * fVar80;
                        local_168.l.vz.field_0.m128[0] =
                             fVar105 * fVar79 + fVar94 * local_118 + fVar113 * fVar97;
                        local_168.l.vz.field_0.m128[1] =
                             fVar105 * 0.0 + fVar94 * fStack_114 + fVar113 * fVar125;
                        local_168.l.vz.field_0.m128[2] =
                             fVar105 * 0.0 + fVar94 * 0.0 + fVar113 * fVar80;
                        local_168.l.vz.field_0.m128[3] =
                             fVar105 * fStack_5c +
                             fVar94 * fStack_10c + fVar113 * (paVar8->field_3).w;
                        fStack_110 = 0.0;
                        local_68 = (ulong)(uint)fVar79;
                        fStack_60 = 0.0;
                        pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                        local_a8._0_4_ =
                             fVar106 * fVar79 + fVar10 * local_118 + fVar98 * fVar97 + *pfVar3;
                        local_a8._4_4_ =
                             fVar106 * 0.0 + fVar10 * fStack_114 + fVar98 * fVar125 + pfVar3[1];
                        fStack_a0 = fVar106 * 0.0 + fVar10 * 0.0 + fVar98 * fVar80 + pfVar3[2];
                        fStack_9c = fVar106 * fStack_5c +
                                    fVar10 * fStack_10c + fVar98 * (paVar8->field_3).w + pfVar3[3];
                        if ((((fVar126 != 0.0) || (NAN(fVar126))) ||
                            ((fVar128 != 0.0 ||
                             ((NAN(fVar128) || (local_168.l.vz.field_0.m128[2] != 0.0)))))) ||
                           (NAN(local_168.l.vz.field_0.m128[2]))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_22;
                        }
                        fVar80 = (float)local_68 * (float)local_128 +
                                 local_118 * local_128._4_4_ + local_108.x * (float)lStack_120;
                        fVar128 = local_68._4_4_ * (float)local_128 +
                                  fStack_114 * local_128._4_4_ + local_108.y * (float)lStack_120;
                        fVar106 = fStack_60 * (float)local_128 +
                                  fStack_110 * local_128._4_4_ + local_108.z * (float)lStack_120;
                        local_168.l.vy.field_0._8_1_ = true;
                        fVar111 = (float)local_f8._0_4_;
                        fVar79 = (float)local_c8._0_4_;
                        fVar125 = (float)local_a8._0_4_;
                        fVar99 = (float)local_a8._4_4_;
                        fVar105 = fStack_a0;
                        fVar94 = local_e8.x;
                        uVar62 = local_168.l.vz.field_0.m128[0];
                        uVar118 = local_168.l.vz.field_0.m128[1];
                        fVar113 = local_d8.z;
                        fVar97 = (float)local_b8._0_4_;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                      std::ostream::put(-0x38);
                      std::ostream::flush();
                      fVar79 = *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc);
                      fVar81 = *(float *)((long)pAVar17 + lVar74 + -0x24);
                      fVar97 = *(float *)((long)pAVar17 + lVar74 + -0x14);
                      fVar125 = *(float *)((long)pAVar17 + lVar74 + -4);
                      auVar13 = *(undefined1 (*) [16])((long)pAVar17 + lVar74 + -0x30);
                      pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x20);
                      fVar80 = *pfVar4;
                      fVar128 = pfVar4[1];
                      pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x10);
                      fVar111 = *pfVar3;
                      fVar99 = pfVar3[1];
                      fVar105 = pfVar3[2];
                      fVar129 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar106 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar98 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                               -fVar125 * fVar125;
                      fVar126 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar127 = fVar97 * fVar97 + fVar126 + -fVar125 * fVar125;
                      fVar138 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar107 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar135 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar79 = fVar97 * fVar125 - fVar79 * fVar81;
                      pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                      fVar94 = *pfVar3;
                      fVar113 = pfVar3[1];
                      fVar10 = pfVar3[2];
                      fVar129 = fVar129 + fVar129;
                      fVar138 = fVar138 + fVar138;
                      fVar106 = fVar106 + fVar106;
                      fVar135 = fVar135 + fVar135;
                      fVar107 = fVar107 + fVar107;
                      fVar79 = fVar79 + fVar79;
                      fVar81 = fVar125 * fVar125 + fVar126 + -fVar97 * fVar97;
                      fVar114 = fVar98 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar116 = fVar98 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                      fVar119 = fVar98 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                      fVar120 = fVar98 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar108 = fVar106 * 1.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar109 = fVar106 * 0.0 + fVar127 * 1.0 + fVar135 * 0.0;
                      fVar110 = fVar106 * 0.0 + fVar127 * 0.0 + fVar135 * 1.0;
                      fVar112 = fVar106 * 0.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar98 = fVar107 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      fVar127 = fVar107 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                      fVar135 = fVar107 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                      fVar95 = fVar107 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      local_188 = auVar13._4_4_;
                      fStack_184 = auVar13._8_4_;
                      local_198 = auVar13._0_4_;
                      fVar124 = local_198 * fVar114 + fVar108 * 0.0 + fVar98 * 0.0;
                      fVar130 = local_198 * fVar116 + fVar109 * 0.0 + fVar127 * 0.0;
                      fVar132 = local_198 * fVar119 + fVar110 * 0.0 + fVar135 * 0.0;
                      fVar133 = local_198 * fVar120 + fVar112 * 0.0 + fVar95 * 0.0;
                      fVar126 = fVar80 * fVar114 + fVar128 * fVar108 + fVar98 * 0.0;
                      fVar129 = fVar80 * fVar116 + fVar128 * fVar109 + fVar127 * 0.0;
                      fVar138 = fVar80 * fVar119 + fVar128 * fVar110 + fVar135 * 0.0;
                      fVar96 = fVar80 * fVar120 + fVar128 * fVar112 + fVar95 * 0.0;
                      local_168.l.vz.field_0.m128[0] =
                           fVar111 * fVar114 + fVar99 * fVar108 + fVar105 * fVar98;
                      local_168.l.vz.field_0.m128[1] =
                           fVar111 * fVar116 + fVar99 * fVar109 + fVar105 * fVar127;
                      local_168.l.vz.field_0.m128[2] =
                           fVar111 * fVar119 + fVar99 * fVar110 + fVar105 * fVar135;
                      local_168.l.vz.field_0.m128[3] =
                           fVar111 * fVar120 + fVar99 * fVar112 + fVar105 * fVar95;
                      fVar79 = *(float *)(lVar18 + 0xc + lVar74);
                      fVar81 = *(float *)(lVar18 + -0x24 + lVar74);
                      fVar97 = *(float *)(lVar18 + -0x14 + lVar74);
                      fVar125 = *(float *)(lVar18 + -4 + lVar74);
                      fVar131 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar106 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar100 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                                -fVar125 * fVar125;
                      fVar128 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar137 = fVar97 * fVar97 + fVar128 + -fVar125 * fVar125;
                      fVar136 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar103 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar139 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar107 = fVar97 * fVar125 - fVar79 * fVar81;
                      pfVar5 = (float *)(lVar18 + -0x30 + lVar74);
                      fVar79 = *pfVar5;
                      pfVar6 = (float *)(lVar18 + -0x20 + lVar74);
                      fVar81 = *pfVar6;
                      fVar80 = pfVar6[1];
                      fVar122 = fVar125 * fVar125 + fVar128 + -fVar97 * fVar97;
                      pfVar3 = (float *)(lVar18 + -0x10 + lVar74);
                      fVar97 = *pfVar3;
                      fVar125 = pfVar3[1];
                      fVar128 = pfVar3[2];
                      fVar131 = fVar131 + fVar131;
                      fVar136 = fVar136 + fVar136;
                      pfVar3 = (float *)(lVar18 + lVar74);
                      fVar111 = *pfVar3;
                      fVar99 = pfVar3[1];
                      fVar105 = pfVar3[2];
                      fVar101 = fVar100 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                      fVar102 = fVar100 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                      fVar136 = fVar100 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                      fVar106 = fVar106 + fVar106;
                      fVar139 = fVar139 + fVar139;
                      fVar103 = fVar103 + fVar103;
                      fVar107 = fVar107 + fVar107;
                      fVar100 = fVar106 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                      fVar131 = fVar106 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                      fVar106 = fVar106 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                      fVar137 = fVar103 * 1.0 + fVar107 * 0.0 + fVar122 * 0.0;
                      fVar139 = fVar103 * 0.0 + fVar107 * 1.0 + fVar122 * 0.0;
                      fVar107 = fVar103 * 0.0 + fVar107 * 0.0 + fVar122 * 1.0;
                      fVar115 = fVar79 * fVar101 + fVar100 * 0.0 + fVar137 * 0.0;
                      fVar117 = fVar79 * fVar102 + fVar131 * 0.0 + fVar139 * 0.0;
                      fVar79 = fVar79 * fVar136 + fVar106 * 0.0 + fVar107 * 0.0;
                      fVar103 = fVar81 * fVar101 + fVar80 * fVar100 + fVar137 * 0.0;
                      fVar122 = fVar81 * fVar102 + fVar80 * fVar131 + fVar139 * 0.0;
                      fVar104 = fVar81 * fVar136 + fVar80 * fVar106 + fVar107 * 0.0;
                      fVar121 = fVar97 * fVar101 + fVar125 * fVar100 + fVar128 * fVar137;
                      fVar123 = fVar97 * fVar102 + fVar125 * fVar131 + fVar128 * fVar139;
                      fVar125 = fVar97 * fVar136 + fVar125 * fVar106 + fVar128 * fVar107;
                      fVar97 = fVar111 * fVar101 + fVar99 * fVar100 + fVar105 * fVar137 +
                               pfVar5[1] + 0.0;
                      fVar100 = fVar111 * fVar102 + fVar99 * fVar131 + fVar105 * fVar139 +
                                pfVar5[2] + 0.0;
                      fVar131 = fVar111 * fVar136 + fVar99 * fVar106 + fVar105 * fVar107 +
                                pfVar6[2] + 0.0;
                      fVar107 = fVar115 * fVar124 +
                                fVar117 * fVar126 + fVar79 * local_168.l.vz.field_0.m128[0];
                      local_198 = fVar115 * fVar130 +
                                  fVar117 * fVar129 + fVar79 * local_168.l.vz.field_0.m128[1];
                      fVar81 = fVar115 * fVar132 +
                               fVar117 * fVar138 + fVar79 * local_168.l.vz.field_0.m128[2];
                      fVar80 = fVar121 * fVar124 +
                               fVar123 * fVar126 + fVar125 * local_168.l.vz.field_0.m128[0];
                      fVar128 = fVar121 * fVar130 +
                                fVar123 * fVar129 + fVar125 * local_168.l.vz.field_0.m128[1];
                      fVar106 = fVar121 * fVar132 +
                                fVar123 * fVar138 + fVar125 * local_168.l.vz.field_0.m128[2];
                      uVar70 = extraout_RDX_21;
                      fVar111 = fVar121 * fVar133 +
                                fVar123 * fVar96 + fVar125 * local_168.l.vz.field_0.m128[3];
                      fVar79 = fVar115 * fVar133 +
                               fVar117 * fVar96 + fVar79 * local_168.l.vz.field_0.m128[3];
                      fVar125 = fVar97 * fVar124 +
                                fVar100 * fVar126 + fVar131 * local_168.l.vz.field_0.m128[0] +
                                fVar94 * fVar114 + fVar113 * fVar108 + fVar10 * fVar98 +
                                local_188 + 0.0;
                      fVar99 = fVar97 * fVar130 +
                               fVar100 * fVar129 + fVar131 * local_168.l.vz.field_0.m128[1] +
                               fVar94 * fVar116 + fVar113 * fVar109 + fVar10 * fVar127 +
                               fStack_184 + 0.0;
                      fVar105 = fVar97 * fVar132 +
                                fVar100 * fVar138 + fVar131 * local_168.l.vz.field_0.m128[2] +
                                fVar94 * fVar119 + fVar113 * fVar110 + fVar10 * fVar135 +
                                pfVar4[2] + 0.0;
                      fVar94 = fVar97 * fVar133 +
                               fVar100 * fVar96 + fVar131 * local_168.l.vz.field_0.m128[3] +
                               fVar94 * fVar120 + fVar113 * fVar112 + fVar10 * fVar95 + 0.0;
                      uVar62 = fVar103 * fVar124 +
                               fVar122 * fVar126 + fVar104 * local_168.l.vz.field_0.m128[0];
                      uVar118 = fVar103 * fVar130 +
                                fVar122 * fVar129 + fVar104 * local_168.l.vz.field_0.m128[1];
                      fVar113 = fVar103 * fVar132 +
                                fVar122 * fVar138 + fVar104 * local_168.l.vz.field_0.m128[2];
                      fVar97 = fVar103 * fVar133 +
                               fVar122 * fVar96 + fVar104 * local_168.l.vz.field_0.m128[3];
                    }
                  }
                  else {
                    pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x24);
                    auVar13._4_4_ = -(uint)(pfVar3[1] != 0.0);
                    auVar13._0_4_ = -(uint)(*pfVar3 != 0.0);
                    auVar13._8_4_ = -(uint)(pfVar3[2] != 1.0);
                    auVar13._12_4_ = -(uint)(pfVar3[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar13);
                    if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       (((uVar75 & 4) != 0 ||
                        (bVar69 = ((byte)uVar75 & 8) >> 3,
                        uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))))
                    goto LAB_0016714e;
                    pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x14);
                    auVar40._4_4_ = -(uint)(pfVar3[1] != 0.0);
                    auVar40._0_4_ = -(uint)(*pfVar3 != 0.0);
                    auVar40._8_4_ = -(uint)(pfVar3[2] != 0.0);
                    auVar40._12_4_ = -(uint)(pfVar3[3] != 1.0);
                    uVar75 = movmskps(uVar75,auVar40);
                    if (((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                        ((uVar75 & 4) != 0)) ||
                       (bVar69 = ((byte)uVar75 & 8) >> 3,
                       uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))
                    goto LAB_0016714e;
                    pfVar3 = (float *)((long)pAVar17 + lVar74 + -4);
                    auVar41._4_4_ = -(uint)(pfVar3[1] != 0.0);
                    auVar41._0_4_ = -(uint)(*pfVar3 != 0.0);
                    auVar41._8_4_ = -(uint)(pfVar3[2] != 0.0);
                    auVar41._12_4_ = -(uint)(pfVar3[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar41);
                    if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       ((uVar75 & 4) != 0)) goto LAB_0016714e;
                    bVar69 = ((byte)uVar75 & 8) >> 3;
                    uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                    uVar70 = (ulong)uVar75;
                    if ((bVar69 != 0) ||
                       ((bVar14 != false &&
                        ((fVar79 = *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc),
                         fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_0016714e;
                    pfVar3 = (float *)(lVar18 + -0x30 + lVar74);
                    fVar107 = *pfVar3;
                    local_198 = pfVar3[1];
                    fVar81 = pfVar3[2];
                    fVar79 = pfVar3[3];
                    pfVar3 = (float *)(lVar18 + -0x20 + lVar74);
                    uVar62 = *pfVar3;
                    uVar118 = pfVar3[1];
                    fVar113 = pfVar3[2];
                    fVar97 = pfVar3[3];
                    pfVar3 = (float *)(lVar18 + -0x10 + lVar74);
                    fVar80 = *pfVar3;
                    fVar128 = pfVar3[1];
                    fVar106 = pfVar3[2];
                    fVar111 = pfVar3[3];
                    pfVar3 = (float *)(lVar18 + lVar74);
                    fVar125 = *pfVar3;
                    fVar99 = pfVar3[1];
                    fVar105 = pfVar3[2];
                    fVar94 = pfVar3[3];
                    local_168.l.vy.field_0._8_1_ = bVar61;
                  }
LAB_00167c45:
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x30))->
                                            field_0 + lVar74);
                  *pfVar3 = fVar107;
                  pfVar3[1] = local_198;
                  pfVar3[2] = fVar81;
                  pfVar3[3] = fVar79;
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x20))->
                                            field_0 + lVar74);
                  *pfVar3 = (float)uVar62;
                  pfVar3[1] = (float)uVar118;
                  pfVar3[2] = fVar113;
                  pfVar3[3] = fVar97;
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x10))->
                                            field_0 + lVar74);
                  *pfVar3 = fVar80;
                  pfVar3[1] = fVar128;
                  pfVar3[2] = fVar106;
                  pfVar3[3] = fVar111;
                  pfVar3 = (float *)(local_168.l.vy.field_0._0_8_ + lVar74);
                  *pfVar3 = fVar125;
                  pfVar3[1] = fVar99;
                  pfVar3[2] = fVar105;
                  pfVar3[3] = fVar94;
                  uVar71 = uVar71 + 1;
                  lVar74 = lVar74 + 0x40;
                  uVar65 = local_168.l.vy.field_0._0_8_;
                } while (uVar71 < (pTVar2->spaces).size_active);
              }
            }
            std::
            vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
            ::emplace_back<embree::SceneGraph::Transformations>
                      ((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                        *)local_48,(Transformations *)local_178);
            alignedFree((void *)local_168.l.vy.field_0._0_8_);
            uVar71 = local_78 + 1;
            pTVar66 = *(pointer *)local_168.p.field_0._8_8_;
            uVar70 = 0xaaaaaaaaaaaaaaab;
          } while (uVar71 < (ulong)(((long)*(pointer *)(local_168.p.field_0._8_8_ + 8) -
                                     (long)pTVar66 >> 4) * -0x5555555555555555));
        }
        pRVar72 = local_90;
        convertInstances(local_80,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   *)local_88,local_90 + 0x10,
                         (vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                          *)local_48);
        std::
        vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
        ::~vector((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   *)local_48);
        (**(code **)(*(long *)pRVar72 + 0x18))(pRVar72);
      }
    }
    else {
      (**(code **)(*plVar63 + 0x10))(plVar63);
      pTVar66 = *(pointer *)local_168.p.field_0._8_8_;
      if (*(pointer *)(local_168.p.field_0._8_8_ + 8) != pTVar66) {
        local_90 = (Ref<embree::SceneGraph::Node> *)(plVar63 + 0x13);
        uVar71 = 0;
        uVar70 = extraout_RDX;
        do {
          pTVar2 = pTVar66 + uVar71;
          sVar16 = pTVar66[uVar71].spaces.size_active;
          local_68 = uVar71;
          if (sVar16 == 1) {
            fVar79 = (pTVar2->time_range).lower;
            fVar81 = (pTVar2->time_range).upper;
            fVar97 = (float)plVar63[0xd];
            fVar125 = (float)((ulong)plVar63[0xd] >> 0x20);
            uVar75 = -(uint)(fVar79 < fVar97);
            uVar77 = -(uint)(fVar81 < fVar125);
            local_178._0_8_ =
                 CONCAT44(~uVar77 & (uint)fVar125,~uVar75 & (uint)fVar79) |
                 CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
            sVar16 = plVar63[0xf];
            local_168.l.vx.field_0._0_8_ = 0;
            local_168.l.vx.field_0._8_8_ = 0;
            local_168.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            if (sVar16 == 0) {
              local_168.l.vy.field_0._8_1_ = false;
            }
            else {
              local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar16 << 6,0x10);
              local_168.l.vy.field_0._8_1_ = false;
              local_168.l.vx.field_0._0_8_ = sVar16;
              local_168.l.vx.field_0._8_8_ = sVar16;
              if (plVar63[0xf] != 0) {
                lVar74 = 0x30;
                uVar71 = 0;
                uVar70 = extraout_RDX_00;
                do {
                  uVar75 = (uint)uVar70;
                  pAVar17 = (pTVar2->spaces).items;
                  lVar18 = plVar63[0x11];
                  bVar14 = pTVar2->quaternion;
                  uVar68 = (undefined7)((ulong)local_168.l.vy.field_0._0_8_ >> 8);
                  uVar64 = CONCAT71(uVar68,bVar14);
                  bVar61 = *(byte *)(plVar63 + 0x12);
                  local_168.l.vy.field_0._8_1_ = false;
                  fVar79 = (pAVar17->l).vx.field_0.m128[0];
                  uVar65 = *(undefined8 *)((long)&(pAVar17->l).vx.field_0 + 4);
                  fVar81 = (float)((ulong)uVar65 >> 0x20);
                  local_198 = (float)uVar65;
                  if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                     (((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))))) {
LAB_00162fa6:
                    uVar65 = *(undefined8 *)(lVar18 + -0x30 + lVar74);
                    fVar97 = (float)uVar65;
                    fVar125 = (float)((ulong)uVar65 >> 0x20);
                    iVar76 = -(uint)(fVar97 != 1.0);
                    iVar78 = -(uint)(fVar125 != 0.0);
                    auVar83._4_4_ = iVar78;
                    auVar83._0_4_ = iVar76;
                    auVar83._8_4_ = iVar78;
                    auVar83._12_4_ = iVar78;
                    auVar82._8_8_ = auVar83._8_8_;
                    auVar82._4_4_ = iVar76;
                    auVar82._0_4_ = iVar76;
                    uVar75 = movmskpd(uVar75,auVar82);
                    fVar79 = *(float *)(lVar18 + -0x28 + lVar74);
                    if (((uVar75 & 1) == 0) &&
                       (((bVar69 = (byte)uVar75 >> 1, bVar69 == 0 && (fVar79 == 0.0)) &&
                        (!NAN(fVar79))))) {
                      pfVar3 = (float *)(lVar18 + -0x24 + lVar74);
                      auVar43._4_4_ = -(uint)(pfVar3[1] != 0.0);
                      auVar43._0_4_ = -(uint)(*pfVar3 != 0.0);
                      auVar43._8_4_ = -(uint)(pfVar3[2] != 1.0);
                      auVar43._12_4_ = -(uint)(pfVar3[3] != 0.0);
                      uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar69),auVar43);
                      if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                         (((uVar75 & 4) == 0 && (bVar69 = ((byte)uVar75 & 8) >> 3, bVar69 == 0)))) {
                        pfVar3 = (float *)(lVar18 + -0x14 + lVar74);
                        auVar44._4_4_ = -(uint)(pfVar3[1] != 0.0);
                        auVar44._0_4_ = -(uint)(*pfVar3 != 0.0);
                        auVar44._8_4_ = -(uint)(pfVar3[2] != 0.0);
                        auVar44._12_4_ = -(uint)(pfVar3[3] != 1.0);
                        uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar69),auVar44);
                        if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                           (((uVar75 & 4) == 0 && (bVar69 = ((byte)uVar75 & 8) >> 3, bVar69 == 0))))
                        {
                          pfVar3 = (float *)(lVar18 + -4 + lVar74);
                          auVar45._4_4_ = -(uint)(pfVar3[1] != 0.0);
                          auVar45._0_4_ = -(uint)(*pfVar3 != 0.0);
                          auVar45._8_4_ = -(uint)(pfVar3[2] != 0.0);
                          auVar45._12_4_ = -(uint)(pfVar3[3] != 0.0);
                          uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar69),auVar45);
                          if ((((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                               ((uVar75 & 4) == 0)) &&
                              (bVar69 = ((byte)uVar75 & 8) >> 3,
                              uVar70 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 == 0)) &&
                             ((bVar61 == 0 ||
                              ((fVar80 = *(float *)(lVar18 + 0xc + lVar74), fVar80 == 1.0 &&
                               (!NAN(fVar80))))))) {
                            fVar80 = (pAVar17->l).vx.field_0.m128[0];
                            local_198 = (pAVar17->l).vx.field_0.m128[1];
                            fVar81 = (pAVar17->l).vx.field_0.m128[2];
                            fVar125 = (pAVar17->l).vx.field_0.m128[3];
                            uVar62 = (pAVar17->l).vy.field_0.m128[0];
                            uVar118 = (pAVar17->l).vy.field_0.m128[1];
                            fVar128 = (pAVar17->l).vy.field_0.m128[2];
                            fVar111 = (pAVar17->l).vy.field_0.m128[3];
                            fVar79 = (pAVar17->l).vz.field_0.m128[0];
                            fVar97 = (pAVar17->l).vz.field_0.m128[1];
                            fVar99 = (pAVar17->l).vz.field_0.m128[2];
                            fVar105 = (pAVar17->l).vz.field_0.m128[3];
                            fVar94 = (pAVar17->p).field_0.m128[0];
                            fVar107 = (pAVar17->p).field_0.m128[1];
                            fVar113 = (pAVar17->p).field_0.m128[2];
                            fVar106 = (pAVar17->p).field_0.m128[3];
                            local_168.l.vy.field_0._8_1_ = bVar14;
                            goto LAB_001636f0;
                          }
                        }
                      }
                    }
                    uVar70 = uVar64 & 0xffffffff;
                    bVar69 = (byte)uVar70 | bVar61;
                    uVar70 = CONCAT71((int7)(uVar70 >> 8),bVar69);
                    if (bVar69 == 0) {
                      fVar113 = (pAVar17->l).vx.field_0.m128[0];
                      fVar126 = (pAVar17->l).vx.field_0.m128[1];
                      fVar127 = (pAVar17->l).vx.field_0.m128[2];
                      fVar129 = (pAVar17->l).vx.field_0.m128[3];
                      fVar135 = (pAVar17->l).vy.field_0.m128[0];
                      fVar138 = (pAVar17->l).vy.field_0.m128[1];
                      fVar95 = (pAVar17->l).vy.field_0.m128[2];
                      fVar96 = (pAVar17->l).vy.field_0.m128[3];
                      fVar100 = (pAVar17->l).vz.field_0.m128[0];
                      fVar131 = (pAVar17->l).vz.field_0.m128[1];
                      fVar101 = (pAVar17->l).vz.field_0.m128[2];
                      fVar102 = (pAVar17->l).vz.field_0.m128[3];
                      fVar80 = fVar97 * fVar113 + fVar125 * fVar135 + fVar79 * fVar100;
                      local_198 = fVar97 * fVar126 + fVar125 * fVar138 + fVar79 * fVar131;
                      fVar81 = fVar97 * fVar127 + fVar125 * fVar95 + fVar79 * fVar101;
                      fVar125 = fVar97 * fVar129 + fVar125 * fVar96 + fVar79 * fVar102;
                      fVar79 = *(float *)(lVar18 + -0x20 + lVar74);
                      fVar97 = *(float *)(lVar18 + -0x1c + lVar74);
                      fVar111 = *(float *)(lVar18 + -0x18 + lVar74);
                      fVar105 = *(float *)(lVar18 + -0x10 + lVar74);
                      uVar62 = fVar79 * fVar113 + fVar97 * fVar135 + fVar111 * fVar100;
                      uVar118 = fVar79 * fVar126 + fVar97 * fVar138 + fVar111 * fVar131;
                      fVar128 = fVar79 * fVar127 + fVar97 * fVar95 + fVar111 * fVar101;
                      fVar111 = fVar79 * fVar129 + fVar97 * fVar96 + fVar111 * fVar102;
                      fVar94 = *(float *)(lVar18 + -0xc + lVar74);
                      fVar107 = *(float *)(lVar18 + -8 + lVar74);
                      fVar79 = fVar105 * fVar113 + fVar94 * fVar135 + fVar107 * fVar100;
                      fVar97 = fVar105 * fVar126 + fVar94 * fVar138 + fVar107 * fVar131;
                      fVar99 = fVar105 * fVar127 + fVar94 * fVar95 + fVar107 * fVar101;
                      fVar105 = fVar105 * fVar129 + fVar94 * fVar96 + fVar107 * fVar102;
                      fVar106 = *(float *)(lVar18 + lVar74);
                      fVar10 = *(float *)(lVar18 + 4 + lVar74);
                      fVar98 = *(float *)(lVar18 + 8 + lVar74);
                      fVar94 = fVar106 * fVar113 + fVar10 * fVar135 + fVar98 * fVar100 +
                               (pAVar17->p).field_0.m128[0];
                      fVar107 = fVar106 * fVar126 + fVar10 * fVar138 + fVar98 * fVar131 +
                                (pAVar17->p).field_0.m128[1];
                      fVar113 = fVar106 * fVar127 + fVar10 * fVar95 + fVar98 * fVar101 +
                                (pAVar17->p).field_0.m128[2];
                      fVar106 = fVar106 * fVar129 + fVar10 * fVar96 + fVar98 * fVar102 +
                                (pAVar17->p).field_0.m128[3];
                    }
                    else {
                      uVar64 = uVar64 & 0xffffffff;
                      bVar69 = (byte)uVar64 & bVar61;
                      uVar70 = CONCAT71((int7)(uVar64 >> 8),bVar69);
                      if (bVar69 == 1) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                   ,0x67);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                        std::ostream::put(-0x38);
                        std::ostream::flush();
                        fVar79 = (pAVar17->p).field_0.m128[3];
                        fVar81 = (pAVar17->l).vx.field_0.m128[3];
                        fVar97 = (pAVar17->l).vy.field_0.m128[3];
                        fVar125 = (pAVar17->l).vz.field_0.m128[3];
                        aVar12 = (pAVar17->l).vx.field_0.field_1;
                        fVar80 = (pAVar17->l).vy.field_0.m128[0];
                        fVar128 = (pAVar17->l).vy.field_0.m128[1];
                        fVar111 = (pAVar17->l).vz.field_0.m128[0];
                        fVar99 = (pAVar17->l).vz.field_0.m128[1];
                        fVar105 = (pAVar17->l).vz.field_0.m128[2];
                        fVar129 = fVar81 * fVar97 + fVar79 * fVar125;
                        fVar107 = fVar81 * fVar97 - fVar79 * fVar125;
                        fVar113 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                                  -fVar125 * fVar125;
                        fVar126 = fVar79 * fVar79 - fVar81 * fVar81;
                        fVar127 = fVar97 * fVar97 + fVar126 + -fVar125 * fVar125;
                        fVar138 = fVar81 * fVar125 - fVar79 * fVar97;
                        fVar94 = fVar79 * fVar97 + fVar81 * fVar125;
                        fVar135 = fVar97 * fVar125 + fVar79 * fVar81;
                        fVar79 = fVar97 * fVar125 - fVar79 * fVar81;
                        fVar106 = (pAVar17->p).field_0.m128[0];
                        fVar10 = (pAVar17->p).field_0.m128[1];
                        fVar98 = (pAVar17->p).field_0.m128[2];
                        fVar129 = fVar129 + fVar129;
                        fVar138 = fVar138 + fVar138;
                        fVar107 = fVar107 + fVar107;
                        fVar135 = fVar135 + fVar135;
                        fVar94 = fVar94 + fVar94;
                        fVar79 = fVar79 + fVar79;
                        fVar81 = fVar125 * fVar125 + fVar126 + -fVar97 * fVar97;
                        fVar114 = fVar113 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                        fVar116 = fVar113 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                        fVar119 = fVar113 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                        fVar121 = fVar113 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                        fVar108 = fVar107 * 1.0 + fVar127 * 0.0 + fVar135 * 0.0;
                        fVar109 = fVar107 * 0.0 + fVar127 * 1.0 + fVar135 * 0.0;
                        fVar110 = fVar107 * 0.0 + fVar127 * 0.0 + fVar135 * 1.0;
                        fVar112 = fVar107 * 0.0 + fVar127 * 0.0 + fVar135 * 0.0;
                        fVar107 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                        fVar113 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                        fVar129 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                        fVar138 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                        local_188 = aVar12.y;
                        fStack_184 = aVar12.z;
                        local_198 = aVar12.x;
                        fVar130 = local_198 * fVar114 + fVar108 * 0.0 + fVar107 * 0.0;
                        fVar132 = local_198 * fVar116 + fVar109 * 0.0 + fVar113 * 0.0;
                        fVar133 = local_198 * fVar119 + fVar110 * 0.0 + fVar129 * 0.0;
                        fVar134 = local_198 * fVar121 + fVar112 * 0.0 + fVar138 * 0.0;
                        fVar126 = fVar80 * fVar114 + fVar128 * fVar108 + fVar107 * 0.0;
                        fVar127 = fVar80 * fVar116 + fVar128 * fVar109 + fVar113 * 0.0;
                        fVar135 = fVar80 * fVar119 + fVar128 * fVar110 + fVar129 * 0.0;
                        fVar95 = fVar80 * fVar121 + fVar128 * fVar112 + fVar138 * 0.0;
                        local_168.l.vz.field_0.m128[0] =
                             fVar111 * fVar114 + fVar99 * fVar108 + fVar105 * fVar107;
                        local_168.l.vz.field_0.m128[1] =
                             fVar111 * fVar116 + fVar99 * fVar109 + fVar105 * fVar113;
                        local_168.l.vz.field_0.m128[2] =
                             fVar111 * fVar119 + fVar99 * fVar110 + fVar105 * fVar129;
                        local_168.l.vz.field_0.m128[3] =
                             fVar111 * fVar121 + fVar99 * fVar112 + fVar105 * fVar138;
                        fVar79 = *(float *)(lVar18 + 0xc + lVar74);
                        fVar81 = *(float *)(lVar18 + -0x24 + lVar74);
                        fVar97 = *(float *)(lVar18 + -0x14 + lVar74);
                        fVar125 = *(float *)(lVar18 + -4 + lVar74);
                        fVar131 = fVar81 * fVar97 + fVar79 * fVar125;
                        fVar96 = fVar81 * fVar97 - fVar79 * fVar125;
                        fVar100 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                                  -fVar125 * fVar125;
                        fVar128 = fVar79 * fVar79 - fVar81 * fVar81;
                        fVar137 = fVar97 * fVar97 + fVar128 + -fVar125 * fVar125;
                        fVar136 = fVar81 * fVar125 - fVar79 * fVar97;
                        fVar103 = fVar79 * fVar97 + fVar81 * fVar125;
                        fVar139 = fVar97 * fVar125 + fVar79 * fVar81;
                        fVar94 = fVar97 * fVar125 - fVar79 * fVar81;
                        pfVar4 = (float *)(lVar18 + -0x30 + lVar74);
                        fVar79 = *pfVar4;
                        pfVar5 = (float *)(lVar18 + -0x20 + lVar74);
                        fVar81 = *pfVar5;
                        fVar80 = pfVar5[1];
                        fVar122 = fVar125 * fVar125 + fVar128 + -fVar97 * fVar97;
                        pfVar3 = (float *)(lVar18 + -0x10 + lVar74);
                        fVar97 = *pfVar3;
                        fVar125 = pfVar3[1];
                        fVar128 = pfVar3[2];
                        fVar131 = fVar131 + fVar131;
                        fVar136 = fVar136 + fVar136;
                        pfVar3 = (float *)(lVar18 + lVar74);
                        fVar111 = *pfVar3;
                        fVar99 = pfVar3[1];
                        fVar105 = pfVar3[2];
                        fVar101 = fVar100 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                        fVar102 = fVar100 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                        fVar136 = fVar100 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                        fVar96 = fVar96 + fVar96;
                        fVar139 = fVar139 + fVar139;
                        fVar103 = fVar103 + fVar103;
                        fVar94 = fVar94 + fVar94;
                        fVar100 = fVar96 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                        fVar131 = fVar96 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                        fVar96 = fVar96 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                        fVar137 = fVar103 * 1.0 + fVar94 * 0.0 + fVar122 * 0.0;
                        fVar139 = fVar103 * 0.0 + fVar94 * 1.0 + fVar122 * 0.0;
                        fVar94 = fVar103 * 0.0 + fVar94 * 0.0 + fVar122 * 1.0;
                        fVar115 = fVar79 * fVar101 + fVar100 * 0.0 + fVar137 * 0.0;
                        fVar117 = fVar79 * fVar102 + fVar131 * 0.0 + fVar139 * 0.0;
                        fVar120 = fVar79 * fVar136 + fVar96 * 0.0 + fVar94 * 0.0;
                        fVar103 = fVar81 * fVar101 + fVar80 * fVar100 + fVar137 * 0.0;
                        fVar122 = fVar81 * fVar102 + fVar80 * fVar131 + fVar139 * 0.0;
                        fVar104 = fVar81 * fVar136 + fVar80 * fVar96 + fVar94 * 0.0;
                        fVar123 = fVar97 * fVar101 + fVar125 * fVar100 + fVar128 * fVar137;
                        fVar124 = fVar97 * fVar102 + fVar125 * fVar131 + fVar128 * fVar139;
                        fVar125 = fVar97 * fVar136 + fVar125 * fVar96 + fVar128 * fVar94;
                        fVar128 = fVar111 * fVar101 + fVar99 * fVar100 + fVar105 * fVar137 +
                                  pfVar4[1] + 0.0;
                        fVar100 = fVar111 * fVar102 + fVar99 * fVar131 + fVar105 * fVar139 +
                                  pfVar4[2] + 0.0;
                        fVar111 = fVar111 * fVar136 + fVar99 * fVar96 + fVar105 * fVar94 +
                                  pfVar5[2] + 0.0;
                        fVar80 = fVar115 * fVar130 +
                                 fVar117 * fVar126 + fVar120 * local_168.l.vz.field_0.m128[0];
                        local_198 = fVar115 * fVar132 +
                                    fVar117 * fVar127 + fVar120 * local_168.l.vz.field_0.m128[1];
                        fVar81 = fVar115 * fVar133 +
                                 fVar117 * fVar135 + fVar120 * local_168.l.vz.field_0.m128[2];
                        fVar79 = fVar123 * fVar130 +
                                 fVar124 * fVar126 + fVar125 * local_168.l.vz.field_0.m128[0];
                        fVar97 = fVar123 * fVar132 +
                                 fVar124 * fVar127 + fVar125 * local_168.l.vz.field_0.m128[1];
                        fVar99 = fVar123 * fVar133 +
                                 fVar124 * fVar135 + fVar125 * local_168.l.vz.field_0.m128[2];
                        uVar70 = extraout_RDX_01;
                        fVar105 = fVar123 * fVar134 +
                                  fVar124 * fVar95 + fVar125 * local_168.l.vz.field_0.m128[3];
                        fVar125 = fVar115 * fVar134 +
                                  fVar117 * fVar95 + fVar120 * local_168.l.vz.field_0.m128[3];
                        fVar94 = fVar128 * fVar130 +
                                 fVar100 * fVar126 + fVar111 * local_168.l.vz.field_0.m128[0] +
                                 fVar106 * fVar114 + fVar10 * fVar108 + fVar98 * fVar107 +
                                 local_188 + 0.0;
                        fVar107 = fVar128 * fVar132 +
                                  fVar100 * fVar127 + fVar111 * local_168.l.vz.field_0.m128[1] +
                                  fVar106 * fVar116 + fVar10 * fVar109 + fVar98 * fVar113 +
                                  fStack_184 + 0.0;
                        fVar113 = fVar128 * fVar133 +
                                  fVar100 * fVar135 + fVar111 * local_168.l.vz.field_0.m128[2] +
                                  fVar106 * fVar119 + fVar10 * fVar110 + fVar98 * fVar129 +
                                  (pAVar17->l).vy.field_0.m128[2] + 0.0;
                        fVar106 = fVar128 * fVar134 +
                                  fVar100 * fVar95 + fVar111 * local_168.l.vz.field_0.m128[3] +
                                  fVar106 * fVar121 + fVar10 * fVar112 + fVar98 * fVar138 + 0.0;
                        uVar62 = fVar103 * fVar130 +
                                 fVar122 * fVar126 + fVar104 * local_168.l.vz.field_0.m128[0];
                        uVar118 = fVar103 * fVar132 +
                                  fVar122 * fVar127 + fVar104 * local_168.l.vz.field_0.m128[1];
                        fVar128 = fVar103 * fVar133 +
                                  fVar122 * fVar135 + fVar104 * local_168.l.vz.field_0.m128[2];
                        fVar111 = fVar103 * fVar134 +
                                  fVar122 * fVar95 + fVar104 * local_168.l.vz.field_0.m128[3];
                      }
                      else {
                        bVar61 = bVar14 ^ 1U | bVar61;
                        if (bVar61 == 0) {
                          local_f8 = ZEXT416((uint)(pAVar17->p).field_0.m128[3]);
                          local_d8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                      )ZEXT416((uint)(pAVar17->l).vx.field_0.m128[3]);
                          local_c8 = ZEXT416((uint)(pAVar17->l).vy.field_0.m128[3]);
                          local_108 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                       )ZEXT416((uint)(pAVar17->l).vz.field_0.m128[3]);
                          pVVar1 = &(pAVar17->l).vy;
                          fVar113 = (pVVar1->field_0).m128[0];
                          fVar106 = (pAVar17->l).vy.field_0.m128[1];
                          local_128 = *(undefined8 *)&pVVar1->field_0;
                          fVar10 = (pAVar17->l).vy.field_0.m128[3];
                          local_e8 = (pVVar1->field_0).field_1;
                          local_118 = (pAVar17->l).vz.field_0.m128[0];
                          fStack_114 = (pAVar17->l).vz.field_0.m128[1];
                          fStack_110 = (pAVar17->l).vz.field_0.m128[2];
                          fStack_10c = (pAVar17->l).vz.field_0.m128[3];
                          local_a8._0_4_ = (pAVar17->l).vx.field_0.m128[0];
                          fStack_9c = (pAVar17->l).vx.field_0.m128[1];
                          pfVar3 = (float *)(lVar18 + -0x30 + lVar74);
                          fVar79 = *pfVar3;
                          fVar97 = pfVar3[1];
                          fVar125 = pfVar3[2];
                          pfVar3 = (float *)(lVar18 + -0x20 + lVar74);
                          fVar128 = *pfVar3;
                          fVar111 = pfVar3[1];
                          fVar99 = pfVar3[2];
                          puVar7 = (ulong *)(lVar18 + -0x10 + lVar74);
                          local_78 = *puVar7;
                          uStack_70 = puVar7[1];
                          pfVar3 = (float *)(lVar18 + lVar74);
                          fVar105 = *pfVar3;
                          fVar94 = pfVar3[1];
                          fVar107 = pfVar3[2];
                          fVar80 = fVar79 * (float)local_a8._0_4_ +
                                   fVar97 * fVar113 + fVar125 * local_118;
                          fVar98 = fVar79 * 0.0 + fVar97 * fVar106 + fVar125 * fStack_114;
                          fVar79 = fVar79 * 0.0 + fVar97 * 0.0 + fVar125 * fStack_110;
                          local_168.l.vz.field_0.m128[0] =
                               fVar128 * (float)local_a8._0_4_ +
                               fVar111 * fVar113 + fVar99 * local_118;
                          local_168.l.vz.field_0.m128[1] =
                               fVar128 * 0.0 + fVar111 * fVar106 + fVar99 * fStack_114;
                          local_168.l.vz.field_0.m128[2] =
                               fVar128 * 0.0 + fVar111 * 0.0 + fVar99 * fStack_110;
                          local_168.l.vz.field_0.m128[3] =
                               fVar128 * fStack_9c + fVar111 * fVar10 + fVar99 * fStack_10c;
                          lStack_120 = (ulong)(uint)fVar10 << 0x20;
                          stack0xffffffffffffff5c = 0;
                          local_b8._0_4_ =
                               fVar105 * (float)local_a8._0_4_ +
                               fVar94 * fVar113 + fVar107 * local_118 + (pAVar17->p).field_0.m128[0]
                          ;
                          local_b8._4_4_ =
                               fVar105 * 0.0 + fVar94 * fVar106 + fVar107 * fStack_114 +
                               (pAVar17->p).field_0.m128[1];
                          fStack_b0 = fVar105 * 0.0 + fVar94 * 0.0 + fVar107 * fStack_110 +
                                      (pAVar17->p).field_0.m128[2];
                          register0x0000128c =
                               fVar105 * fStack_9c + fVar94 * fVar10 + fVar107 * fStack_10c +
                               (pAVar17->p).field_0.m128[3];
                          if (((fVar98 != 0.0) || (NAN(fVar98))) ||
                             ((fVar79 != 0.0 ||
                              (((NAN(fVar79) || (local_168.l.vz.field_0.m128[2] != 0.0)) ||
                               (NAN(local_168.l.vz.field_0.m128[2]))))))) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                       ,0x61);
                            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                            std::ostream::put(-0x38);
                            std::ostream::flush();
                            uVar70 = extraout_RDX_03;
                          }
                          fVar79 = (float)local_a8._0_4_ * (float)local_78 +
                                   (float)local_128 * local_78._4_4_ + local_118 * (float)uStack_70;
                          fVar97 = (float)local_a8._4_4_ * (float)local_78 +
                                   local_128._4_4_ * local_78._4_4_ + fStack_114 * (float)uStack_70;
                          fVar99 = fStack_a0 * (float)local_78 +
                                   (float)lStack_120 * local_78._4_4_ +
                                   fStack_110 * (float)uStack_70;
                          local_168.l.vy.field_0._8_1_ = true;
                          fVar105 = local_108.x;
                          fVar125 = local_d8.x;
                          fVar94 = (float)local_b8._0_4_;
                          fVar107 = (float)local_b8._4_4_;
                          fVar113 = fStack_b0;
                          fVar106 = (float)local_f8._0_4_;
                          uVar62 = local_168.l.vz.field_0.m128[0];
                          uVar118 = local_168.l.vz.field_0.m128[1];
                          fVar128 = local_e8.z;
                          fVar111 = (float)local_c8._0_4_;
                        }
                        else {
                          if (((local_198 != 0.0) || (NAN(local_198))) ||
                             ((fVar81 != 0.0 ||
                              ((NAN(fVar81) ||
                               (uVar65 = *(undefined8 *)&(pAVar17->l).vz.field_0,
                               auVar23._4_4_ = -(uint)((pAVar17->l).vy.field_0.m128[0] != 0.0),
                               auVar23._0_4_ = -(uint)((pAVar17->l).vy.field_0.m128[2] != 0.0),
                               auVar23._8_4_ = -(uint)((float)uVar65 != 0.0),
                               auVar23._12_4_ = -(uint)((float)((ulong)uVar65 >> 0x20) != 0.0),
                               uVar62 = movmskps((int)CONCAT71(uVar68,bVar61),auVar23),
                               (char)uVar62 != '\0')))))) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                       ,0x83);
                            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                            std::ostream::put(-0x38);
                            std::ostream::flush();
                            uVar70 = extraout_RDX_02;
                          }
                          pfVar4 = (float *)(lVar18 + -0x30 + lVar74);
                          pfVar5 = (float *)(lVar18 + -0x20 + lVar74);
                          pfVar6 = (float *)(lVar18 + -0x10 + lVar74);
                          fVar79 = *pfVar6;
                          fVar97 = pfVar6[1];
                          pfVar3 = (float *)(lVar18 + lVar74);
                          uVar65 = *(undefined8 *)&(pAVar17->p).field_0;
                          fVar80 = (pAVar17->l).vx.field_0.m128[0] * *pfVar4;
                          local_198 = pfVar4[1] + (float)uVar65;
                          fVar81 = pfVar4[2] + (float)((ulong)uVar65 >> 0x20);
                          fVar99 = pfVar6[2] * (pAVar17->l).vz.field_0.m128[2];
                          local_168.l.vy.field_0._8_1_ = true;
                          fVar105 = pfVar6[3];
                          fVar125 = pfVar4[3];
                          fVar94 = *pfVar3;
                          fVar107 = pfVar3[1];
                          fVar113 = pfVar3[2];
                          fVar106 = pfVar3[3];
                          uVar62 = *pfVar5;
                          uVar118 = pfVar5[1] * (pAVar17->l).vy.field_0.m128[1];
                          fVar128 = pfVar5[2] + (pAVar17->p).field_0.m128[2];
                          fVar111 = pfVar5[3];
                        }
                      }
                    }
                  }
                  else {
                    auVar20._4_4_ = -(uint)((pAVar17->l).vy.field_0.m128[0] != 0.0);
                    auVar20._0_4_ = -(uint)((pAVar17->l).vx.field_0.m128[3] != 0.0);
                    auVar20._8_4_ = -(uint)((pAVar17->l).vy.field_0.m128[1] != 1.0);
                    auVar20._12_4_ = -(uint)((pAVar17->l).vy.field_0.m128[2] != 0.0);
                    uVar75 = movmskps(uVar75,auVar20);
                    if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       (((uVar75 & 4) != 0 ||
                        (bVar69 = ((byte)uVar75 & 8) >> 3,
                        uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))))
                    goto LAB_00162fa6;
                    auVar21._4_4_ = -(uint)((pAVar17->l).vz.field_0.m128[0] != 0.0);
                    auVar21._0_4_ = -(uint)((pAVar17->l).vy.field_0.m128[3] != 0.0);
                    auVar21._8_4_ = -(uint)((pAVar17->l).vz.field_0.m128[1] != 0.0);
                    auVar21._12_4_ = -(uint)((pAVar17->l).vz.field_0.m128[2] != 1.0);
                    uVar75 = movmskps(uVar75,auVar21);
                    if (((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                        ((uVar75 & 4) != 0)) ||
                       (bVar69 = ((byte)uVar75 & 8) >> 3,
                       uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))
                    goto LAB_00162fa6;
                    auVar22._4_4_ = -(uint)((pAVar17->p).field_0.m128[0] != 0.0);
                    auVar22._0_4_ = -(uint)((pAVar17->l).vz.field_0.m128[3] != 0.0);
                    auVar22._8_4_ = -(uint)((pAVar17->p).field_0.m128[1] != 0.0);
                    auVar22._12_4_ = -(uint)((pAVar17->p).field_0.m128[2] != 0.0);
                    uVar75 = movmskps(uVar75,auVar22);
                    if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       ((uVar75 & 4) != 0)) goto LAB_00162fa6;
                    bVar69 = ((byte)uVar75 & 8) >> 3;
                    uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                    uVar70 = (ulong)uVar75;
                    if ((bVar69 != 0) ||
                       ((bVar14 != false &&
                        ((fVar79 = (pAVar17->p).field_0.m128[3], fVar79 != 1.0 || (NAN(fVar79)))))))
                    goto LAB_00162fa6;
                    pfVar3 = (float *)(lVar18 + -0x30 + lVar74);
                    fVar80 = *pfVar3;
                    local_198 = pfVar3[1];
                    fVar81 = pfVar3[2];
                    fVar125 = pfVar3[3];
                    pfVar3 = (float *)(lVar18 + -0x20 + lVar74);
                    uVar62 = *pfVar3;
                    uVar118 = pfVar3[1];
                    fVar128 = pfVar3[2];
                    fVar111 = pfVar3[3];
                    pfVar3 = (float *)(lVar18 + -0x10 + lVar74);
                    fVar79 = *pfVar3;
                    fVar97 = pfVar3[1];
                    fVar99 = pfVar3[2];
                    fVar105 = pfVar3[3];
                    pfVar3 = (float *)(lVar18 + lVar74);
                    fVar94 = *pfVar3;
                    fVar107 = pfVar3[1];
                    fVar113 = pfVar3[2];
                    fVar106 = pfVar3[3];
                    local_168.l.vy.field_0._8_1_ = bVar61;
                  }
LAB_001636f0:
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x30))->
                                            field_0 + lVar74);
                  *pfVar3 = fVar80;
                  pfVar3[1] = local_198;
                  pfVar3[2] = fVar81;
                  pfVar3[3] = fVar125;
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x20))->
                                            field_0 + lVar74);
                  *pfVar3 = (float)uVar62;
                  pfVar3[1] = (float)uVar118;
                  pfVar3[2] = fVar128;
                  pfVar3[3] = fVar111;
                  pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x10))->
                                            field_0 + lVar74);
                  *pfVar3 = fVar79;
                  pfVar3[1] = fVar97;
                  pfVar3[2] = fVar99;
                  pfVar3[3] = fVar105;
                  pfVar3 = (float *)(local_168.l.vy.field_0._0_8_ + lVar74);
                  *pfVar3 = fVar94;
                  pfVar3[1] = fVar107;
                  pfVar3[2] = fVar113;
                  pfVar3[3] = fVar106;
                  uVar71 = uVar71 + 1;
                  lVar74 = lVar74 + 0x40;
                } while (uVar71 < (ulong)plVar63[0xf]);
              }
            }
          }
          else if (plVar63[0xf] == 1) {
            fVar79 = (pTVar2->time_range).lower;
            fVar81 = (pTVar2->time_range).upper;
            fVar97 = (float)plVar63[0xd];
            fVar125 = (float)((ulong)plVar63[0xd] >> 0x20);
            uVar75 = -(uint)(fVar79 < fVar97);
            uVar77 = -(uint)(fVar81 < fVar125);
            local_178._0_8_ =
                 CONCAT44(~uVar77 & (uint)fVar125,~uVar75 & (uint)fVar79) |
                 CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
            local_168.l.vx.field_0._0_8_ = 0;
            local_168.l.vx.field_0._8_8_ = 0;
            local_168.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            if (sVar16 != 0) {
              local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar16 << 6,0x10);
              uVar70 = extraout_RDX_04;
              local_168.l.vx.field_0._8_8_ = sVar16;
            }
            uVar65 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (pTVar2->quaternion == false) {
              uVar65 = ZEXT48(*(uint *)(plVar63 + 0x12));
            }
            local_168.l.vy.field_0._8_1_ = (undefined1)uVar65;
            local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
            if ((pTVar2->spaces).size_active != 0) {
              lVar74 = 0x30;
              uVar71 = 0;
              do {
                uVar75 = (uint)uVar70;
                pAVar17 = (pTVar2->spaces).items;
                pfVar3 = (float *)plVar63[0x11];
                bVar14 = pTVar2->quaternion;
                uVar68 = (undefined7)((ulong)uVar65 >> 8);
                uVar64 = CONCAT71(uVar68,bVar14);
                bVar61 = *(byte *)(plVar63 + 0x12);
                local_168.l.vy.field_0._8_1_ = false;
                fVar79 = *(float *)((long)pAVar17 + lVar74 + -0x30);
                uVar65 = *(undefined8 *)((long)pAVar17 + lVar74 + -0x2c);
                fVar81 = (float)((ulong)uVar65 >> 0x20);
                local_198 = (float)uVar65;
                if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                    ((NAN(local_198) || (fVar81 != 0.0)))) || (NAN(fVar81))) {
LAB_00163c8d:
                  fVar97 = (float)*(undefined8 *)pfVar3;
                  fVar125 = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20);
                  iVar76 = -(uint)(fVar97 != 1.0);
                  iVar78 = -(uint)(fVar125 != 0.0);
                  auVar85._4_4_ = iVar78;
                  auVar85._0_4_ = iVar76;
                  auVar85._8_4_ = iVar78;
                  auVar85._12_4_ = iVar78;
                  auVar84._8_8_ = auVar85._8_8_;
                  auVar84._4_4_ = iVar76;
                  auVar84._0_4_ = iVar76;
                  uVar75 = movmskpd(uVar75,auVar84);
                  fVar79 = pfVar3[2];
                  if (((uVar75 & 1) == 0) &&
                     (((bVar69 = (byte)uVar75 >> 1, bVar69 == 0 && (fVar79 == 0.0)) &&
                      (!NAN(fVar79))))) {
                    auVar46._4_4_ = -(uint)(pfVar3[4] != 0.0);
                    auVar46._0_4_ = -(uint)(pfVar3[3] != 0.0);
                    auVar46._8_4_ = -(uint)(pfVar3[5] != 1.0);
                    auVar46._12_4_ = -(uint)(pfVar3[6] != 0.0);
                    uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar69),auVar46);
                    if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       (((uVar75 & 4) == 0 && (bVar69 = ((byte)uVar75 & 8) >> 3, bVar69 == 0)))) {
                      auVar47._4_4_ = -(uint)(pfVar3[8] != 0.0);
                      auVar47._0_4_ = -(uint)(pfVar3[7] != 0.0);
                      auVar47._8_4_ = -(uint)(pfVar3[9] != 0.0);
                      auVar47._12_4_ = -(uint)(pfVar3[10] != 1.0);
                      uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar69),auVar47);
                      if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                         (((uVar75 & 4) == 0 && (bVar69 = ((byte)uVar75 & 8) >> 3, bVar69 == 0)))) {
                        auVar48._4_4_ = -(uint)(pfVar3[0xc] != 0.0);
                        auVar48._0_4_ = -(uint)(pfVar3[0xb] != 0.0);
                        auVar48._8_4_ = -(uint)(pfVar3[0xd] != 0.0);
                        auVar48._12_4_ = -(uint)(pfVar3[0xe] != 0.0);
                        uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar69),auVar48);
                        if ((((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                             ((uVar75 & 4) == 0)) &&
                            (bVar69 = ((byte)uVar75 & 8) >> 3,
                            uVar70 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 == 0)) &&
                           ((bVar61 == 0 || ((pfVar3[0xf] == 1.0 && (!NAN(pfVar3[0xf]))))))) {
                          pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x30);
                          fVar80 = *pfVar3;
                          local_198 = pfVar3[1];
                          fVar81 = pfVar3[2];
                          fVar125 = pfVar3[3];
                          pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x20);
                          uVar62 = *pfVar3;
                          uVar118 = pfVar3[1];
                          fVar128 = pfVar3[2];
                          fVar111 = pfVar3[3];
                          pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x10);
                          fVar79 = *pfVar3;
                          fVar97 = pfVar3[1];
                          fVar99 = pfVar3[2];
                          fVar105 = pfVar3[3];
                          pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                          fVar94 = *pfVar3;
                          fVar107 = pfVar3[1];
                          fVar113 = pfVar3[2];
                          fVar106 = pfVar3[3];
                          local_168.l.vy.field_0._8_1_ = bVar14;
                          goto LAB_001643d5;
                        }
                      }
                    }
                  }
                  uVar70 = uVar64 & 0xffffffff;
                  bVar69 = (byte)uVar70 | bVar61;
                  uVar70 = CONCAT71((int7)(uVar70 >> 8),bVar69);
                  if (bVar69 == 0) {
                    pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x30);
                    fVar113 = *pfVar4;
                    fVar126 = pfVar4[1];
                    fVar127 = pfVar4[2];
                    fVar129 = pfVar4[3];
                    pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x20);
                    fVar135 = *pfVar4;
                    fVar138 = pfVar4[1];
                    fVar95 = pfVar4[2];
                    fVar96 = pfVar4[3];
                    pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x10);
                    fVar100 = *pfVar4;
                    fVar131 = pfVar4[1];
                    fVar101 = pfVar4[2];
                    fVar102 = pfVar4[3];
                    fVar80 = fVar97 * fVar113 + fVar125 * fVar135 + fVar79 * fVar100;
                    local_198 = fVar97 * fVar126 + fVar125 * fVar138 + fVar79 * fVar131;
                    fVar81 = fVar97 * fVar127 + fVar125 * fVar95 + fVar79 * fVar101;
                    fVar125 = fVar97 * fVar129 + fVar125 * fVar96 + fVar79 * fVar102;
                    fVar79 = pfVar3[4];
                    fVar97 = pfVar3[5];
                    fVar111 = pfVar3[6];
                    fVar105 = pfVar3[8];
                    uVar62 = fVar79 * fVar113 + fVar97 * fVar135 + fVar111 * fVar100;
                    uVar118 = fVar79 * fVar126 + fVar97 * fVar138 + fVar111 * fVar131;
                    fVar128 = fVar79 * fVar127 + fVar97 * fVar95 + fVar111 * fVar101;
                    fVar111 = fVar79 * fVar129 + fVar97 * fVar96 + fVar111 * fVar102;
                    fVar94 = pfVar3[9];
                    fVar107 = pfVar3[10];
                    fVar79 = fVar105 * fVar113 + fVar94 * fVar135 + fVar107 * fVar100;
                    fVar97 = fVar105 * fVar126 + fVar94 * fVar138 + fVar107 * fVar131;
                    fVar99 = fVar105 * fVar127 + fVar94 * fVar95 + fVar107 * fVar101;
                    fVar105 = fVar105 * fVar129 + fVar94 * fVar96 + fVar107 * fVar102;
                    fVar106 = pfVar3[0xc];
                    fVar10 = pfVar3[0xd];
                    fVar98 = pfVar3[0xe];
                    pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                    fVar94 = fVar106 * fVar113 + fVar10 * fVar135 + fVar98 * fVar100 + *pfVar3;
                    fVar107 = fVar106 * fVar126 + fVar10 * fVar138 + fVar98 * fVar131 + pfVar3[1];
                    fVar113 = fVar106 * fVar127 + fVar10 * fVar95 + fVar98 * fVar101 + pfVar3[2];
                    fVar106 = fVar106 * fVar129 + fVar10 * fVar96 + fVar98 * fVar102 + pfVar3[3];
                  }
                  else {
                    uVar64 = uVar64 & 0xffffffff;
                    bVar69 = (byte)uVar64 & bVar61;
                    uVar70 = CONCAT71((int7)(uVar64 >> 8),bVar69);
                    if (bVar69 == 1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                      std::ostream::put(-0x38);
                      std::ostream::flush();
                      fVar79 = *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc);
                      fVar81 = *(float *)((long)pAVar17 + lVar74 + -0x24);
                      fVar97 = *(float *)((long)pAVar17 + lVar74 + -0x14);
                      fVar125 = *(float *)((long)pAVar17 + lVar74 + -4);
                      auVar13 = *(undefined1 (*) [16])((long)pAVar17 + lVar74 + -0x30);
                      pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x20);
                      fVar80 = *pfVar4;
                      fVar128 = pfVar4[1];
                      pfVar5 = (float *)((long)pAVar17 + lVar74 + -0x10);
                      fVar111 = *pfVar5;
                      fVar99 = pfVar5[1];
                      fVar105 = pfVar5[2];
                      fVar129 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar107 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar113 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                                -fVar125 * fVar125;
                      fVar126 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar127 = fVar97 * fVar97 + fVar126 + -fVar125 * fVar125;
                      fVar138 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar94 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar135 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar79 = fVar97 * fVar125 - fVar79 * fVar81;
                      pfVar5 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                      fVar106 = *pfVar5;
                      fVar10 = pfVar5[1];
                      fVar98 = pfVar5[2];
                      fVar129 = fVar129 + fVar129;
                      fVar138 = fVar138 + fVar138;
                      fVar107 = fVar107 + fVar107;
                      fVar135 = fVar135 + fVar135;
                      fVar94 = fVar94 + fVar94;
                      fVar79 = fVar79 + fVar79;
                      fVar81 = fVar125 * fVar125 + fVar126 + -fVar97 * fVar97;
                      fVar114 = fVar113 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar116 = fVar113 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                      fVar119 = fVar113 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                      fVar121 = fVar113 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar108 = fVar107 * 1.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar109 = fVar107 * 0.0 + fVar127 * 1.0 + fVar135 * 0.0;
                      fVar110 = fVar107 * 0.0 + fVar127 * 0.0 + fVar135 * 1.0;
                      fVar112 = fVar107 * 0.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar107 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      fVar113 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                      fVar129 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                      fVar138 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      local_188 = auVar13._4_4_;
                      fStack_184 = auVar13._8_4_;
                      local_198 = auVar13._0_4_;
                      fVar130 = local_198 * fVar114 + fVar108 * 0.0 + fVar107 * 0.0;
                      fVar132 = local_198 * fVar116 + fVar109 * 0.0 + fVar113 * 0.0;
                      fVar133 = local_198 * fVar119 + fVar110 * 0.0 + fVar129 * 0.0;
                      fVar134 = local_198 * fVar121 + fVar112 * 0.0 + fVar138 * 0.0;
                      fVar126 = fVar80 * fVar114 + fVar128 * fVar108 + fVar107 * 0.0;
                      fVar127 = fVar80 * fVar116 + fVar128 * fVar109 + fVar113 * 0.0;
                      fVar135 = fVar80 * fVar119 + fVar128 * fVar110 + fVar129 * 0.0;
                      fVar95 = fVar80 * fVar121 + fVar128 * fVar112 + fVar138 * 0.0;
                      local_168.l.vz.field_0.m128[0] =
                           fVar111 * fVar114 + fVar99 * fVar108 + fVar105 * fVar107;
                      local_168.l.vz.field_0.m128[1] =
                           fVar111 * fVar116 + fVar99 * fVar109 + fVar105 * fVar113;
                      local_168.l.vz.field_0.m128[2] =
                           fVar111 * fVar119 + fVar99 * fVar110 + fVar105 * fVar129;
                      local_168.l.vz.field_0.m128[3] =
                           fVar111 * fVar121 + fVar99 * fVar112 + fVar105 * fVar138;
                      fVar79 = pfVar3[0xf];
                      fVar81 = pfVar3[3];
                      fVar97 = pfVar3[7];
                      fVar125 = pfVar3[0xb];
                      fVar131 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar96 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar100 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                                -fVar125 * fVar125;
                      fVar128 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar137 = fVar97 * fVar97 + fVar128 + -fVar125 * fVar125;
                      fVar136 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar103 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar139 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar94 = fVar97 * fVar125 - fVar79 * fVar81;
                      fVar79 = *pfVar3;
                      fVar81 = pfVar3[4];
                      fVar80 = pfVar3[5];
                      fVar122 = fVar125 * fVar125 + fVar128 + -fVar97 * fVar97;
                      fVar97 = pfVar3[8];
                      fVar125 = pfVar3[9];
                      fVar128 = pfVar3[10];
                      fVar131 = fVar131 + fVar131;
                      fVar136 = fVar136 + fVar136;
                      fVar111 = pfVar3[0xc];
                      fVar99 = pfVar3[0xd];
                      fVar105 = pfVar3[0xe];
                      fVar101 = fVar100 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                      fVar102 = fVar100 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                      fVar136 = fVar100 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                      fVar96 = fVar96 + fVar96;
                      fVar139 = fVar139 + fVar139;
                      fVar103 = fVar103 + fVar103;
                      fVar94 = fVar94 + fVar94;
                      fVar100 = fVar96 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                      fVar131 = fVar96 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                      fVar96 = fVar96 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                      fVar137 = fVar103 * 1.0 + fVar94 * 0.0 + fVar122 * 0.0;
                      fVar139 = fVar103 * 0.0 + fVar94 * 1.0 + fVar122 * 0.0;
                      fVar94 = fVar103 * 0.0 + fVar94 * 0.0 + fVar122 * 1.0;
                      fVar115 = fVar79 * fVar101 + fVar100 * 0.0 + fVar137 * 0.0;
                      fVar117 = fVar79 * fVar102 + fVar131 * 0.0 + fVar139 * 0.0;
                      fVar120 = fVar79 * fVar136 + fVar96 * 0.0 + fVar94 * 0.0;
                      fVar103 = fVar81 * fVar101 + fVar80 * fVar100 + fVar137 * 0.0;
                      fVar122 = fVar81 * fVar102 + fVar80 * fVar131 + fVar139 * 0.0;
                      fVar104 = fVar81 * fVar136 + fVar80 * fVar96 + fVar94 * 0.0;
                      fVar123 = fVar97 * fVar101 + fVar125 * fVar100 + fVar128 * fVar137;
                      fVar124 = fVar97 * fVar102 + fVar125 * fVar131 + fVar128 * fVar139;
                      fVar125 = fVar97 * fVar136 + fVar125 * fVar96 + fVar128 * fVar94;
                      fVar128 = fVar111 * fVar101 + fVar99 * fVar100 + fVar105 * fVar137 +
                                pfVar3[1] + 0.0;
                      fVar100 = fVar111 * fVar102 + fVar99 * fVar131 + fVar105 * fVar139 +
                                pfVar3[2] + 0.0;
                      fVar111 = fVar111 * fVar136 + fVar99 * fVar96 + fVar105 * fVar94 +
                                pfVar3[6] + 0.0;
                      fVar80 = fVar115 * fVar130 +
                               fVar117 * fVar126 + fVar120 * local_168.l.vz.field_0.m128[0];
                      local_198 = fVar115 * fVar132 +
                                  fVar117 * fVar127 + fVar120 * local_168.l.vz.field_0.m128[1];
                      fVar81 = fVar115 * fVar133 +
                               fVar117 * fVar135 + fVar120 * local_168.l.vz.field_0.m128[2];
                      fVar79 = fVar123 * fVar130 +
                               fVar124 * fVar126 + fVar125 * local_168.l.vz.field_0.m128[0];
                      fVar97 = fVar123 * fVar132 +
                               fVar124 * fVar127 + fVar125 * local_168.l.vz.field_0.m128[1];
                      fVar99 = fVar123 * fVar133 +
                               fVar124 * fVar135 + fVar125 * local_168.l.vz.field_0.m128[2];
                      uVar70 = extraout_RDX_05;
                      fVar105 = fVar123 * fVar134 +
                                fVar124 * fVar95 + fVar125 * local_168.l.vz.field_0.m128[3];
                      fVar125 = fVar115 * fVar134 +
                                fVar117 * fVar95 + fVar120 * local_168.l.vz.field_0.m128[3];
                      fVar94 = fVar128 * fVar130 +
                               fVar100 * fVar126 + fVar111 * local_168.l.vz.field_0.m128[0] +
                               fVar106 * fVar114 + fVar10 * fVar108 + fVar98 * fVar107 +
                               local_188 + 0.0;
                      fVar107 = fVar128 * fVar132 +
                                fVar100 * fVar127 + fVar111 * local_168.l.vz.field_0.m128[1] +
                                fVar106 * fVar116 + fVar10 * fVar109 + fVar98 * fVar113 +
                                fStack_184 + 0.0;
                      fVar113 = fVar128 * fVar133 +
                                fVar100 * fVar135 + fVar111 * local_168.l.vz.field_0.m128[2] +
                                fVar106 * fVar119 + fVar10 * fVar110 + fVar98 * fVar129 +
                                pfVar4[2] + 0.0;
                      fVar106 = fVar128 * fVar134 +
                                fVar100 * fVar95 + fVar111 * local_168.l.vz.field_0.m128[3] +
                                fVar106 * fVar121 + fVar10 * fVar112 + fVar98 * fVar138 + 0.0;
                      uVar62 = fVar103 * fVar130 +
                               fVar122 * fVar126 + fVar104 * local_168.l.vz.field_0.m128[0];
                      uVar118 = fVar103 * fVar132 +
                                fVar122 * fVar127 + fVar104 * local_168.l.vz.field_0.m128[1];
                      fVar128 = fVar103 * fVar133 +
                                fVar122 * fVar135 + fVar104 * local_168.l.vz.field_0.m128[2];
                      fVar111 = fVar103 * fVar134 +
                                fVar122 * fVar95 + fVar104 * local_168.l.vz.field_0.m128[3];
                    }
                    else {
                      bVar61 = bVar14 ^ 1U | bVar61;
                      if (bVar61 == 0) {
                        local_f8 = ZEXT416(*(uint *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc))
                        ;
                        local_d8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                    )ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -0x24));
                        local_c8 = ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -0x14));
                        local_108 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                     )ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -4));
                        paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                  *)((long)pAVar17 + lVar74 + -0x20);
                        fVar113 = paVar8->x;
                        fVar106 = paVar8->y;
                        local_128._0_4_ = paVar8->x;
                        local_128._4_4_ = paVar8->y;
                        fVar10 = (paVar8->field_3).w;
                        local_e8 = *paVar8;
                        pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x10);
                        local_118 = *pfVar4;
                        fStack_114 = pfVar4[1];
                        fStack_110 = pfVar4[2];
                        fStack_10c = pfVar4[3];
                        pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x30);
                        local_a8._0_4_ = *pfVar4;
                        fStack_9c = pfVar4[1];
                        fVar79 = *pfVar3;
                        fVar97 = pfVar3[1];
                        fVar125 = pfVar3[2];
                        fVar128 = pfVar3[4];
                        fVar111 = pfVar3[5];
                        fVar99 = pfVar3[6];
                        local_78 = *(ulong *)(pfVar3 + 8);
                        uStack_70 = *(ulong *)(pfVar3 + 10);
                        fVar105 = pfVar3[0xc];
                        fVar94 = pfVar3[0xd];
                        fVar107 = pfVar3[0xe];
                        fVar80 = fVar79 * (float)local_a8._0_4_ +
                                 fVar97 * fVar113 + fVar125 * local_118;
                        fVar98 = fVar79 * 0.0 + fVar97 * fVar106 + fVar125 * fStack_114;
                        fVar79 = fVar79 * 0.0 + fVar97 * 0.0 + fVar125 * fStack_110;
                        local_168.l.vz.field_0.m128[0] =
                             fVar128 * (float)local_a8._0_4_ +
                             fVar111 * fVar113 + fVar99 * local_118;
                        local_168.l.vz.field_0.m128[1] =
                             fVar128 * 0.0 + fVar111 * fVar106 + fVar99 * fStack_114;
                        local_168.l.vz.field_0.m128[2] =
                             fVar128 * 0.0 + fVar111 * 0.0 + fVar99 * fStack_110;
                        local_168.l.vz.field_0.m128[3] =
                             fVar128 * fStack_9c + fVar111 * fVar10 + fVar99 * fStack_10c;
                        lStack_120 = (ulong)(uint)fVar10 << 0x20;
                        stack0xffffffffffffff5c = 0;
                        pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                        local_b8._0_4_ =
                             fVar105 * (float)local_a8._0_4_ +
                             fVar94 * fVar113 + fVar107 * local_118 + *pfVar3;
                        local_b8._4_4_ =
                             fVar105 * 0.0 + fVar94 * fVar106 + fVar107 * fStack_114 + pfVar3[1];
                        fStack_b0 = fVar105 * 0.0 + fVar94 * 0.0 + fVar107 * fStack_110 + pfVar3[2];
                        register0x0000128c =
                             fVar105 * fStack_9c + fVar94 * fVar10 + fVar107 * fStack_10c +
                             pfVar3[3];
                        if (((fVar98 != 0.0) || (NAN(fVar98))) ||
                           ((fVar79 != 0.0 ||
                            (((NAN(fVar79) || (local_168.l.vz.field_0.m128[2] != 0.0)) ||
                             (NAN(local_168.l.vz.field_0.m128[2]))))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_07;
                        }
                        fVar79 = (float)local_a8._0_4_ * (float)local_78 +
                                 (float)local_128 * local_78._4_4_ + local_118 * (float)uStack_70;
                        fVar97 = (float)local_a8._4_4_ * (float)local_78 +
                                 local_128._4_4_ * local_78._4_4_ + fStack_114 * (float)uStack_70;
                        fVar99 = fStack_a0 * (float)local_78 +
                                 (float)lStack_120 * local_78._4_4_ + fStack_110 * (float)uStack_70;
                        local_168.l.vy.field_0._8_1_ = true;
                        fVar105 = local_108.x;
                        fVar125 = local_d8.x;
                        fVar94 = (float)local_b8._0_4_;
                        fVar107 = (float)local_b8._4_4_;
                        fVar113 = fStack_b0;
                        fVar106 = (float)local_f8._0_4_;
                        uVar62 = local_168.l.vz.field_0.m128[0];
                        uVar118 = local_168.l.vz.field_0.m128[1];
                        fVar128 = local_e8.z;
                        fVar111 = (float)local_c8._0_4_;
                      }
                      else {
                        if (((local_198 != 0.0) || (NAN(local_198))) ||
                           ((fVar81 != 0.0 ||
                            ((NAN(fVar81) ||
                             (uVar65 = *(undefined8 *)((long)pAVar17 + lVar74 + -0x10),
                             auVar27._4_4_ =
                                  -(uint)(*(float *)((long)pAVar17 + lVar74 + -0x20) != 0.0),
                             auVar27._0_4_ =
                                  -(uint)(*(float *)((long)pAVar17 + lVar74 + -0x18) != 0.0),
                             auVar27._8_4_ = -(uint)((float)uVar65 != 0.0),
                             auVar27._12_4_ = -(uint)((float)((ulong)uVar65 >> 0x20) != 0.0),
                             uVar62 = movmskps((int)CONCAT71(uVar68,bVar61),auVar27),
                             (char)uVar62 != '\0')))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_06;
                        }
                        fVar79 = pfVar3[8];
                        fVar97 = pfVar3[9];
                        uVar65 = *(undefined8 *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                        fVar80 = *(float *)((long)pAVar17 + lVar74 + -0x30) * *pfVar3;
                        local_198 = pfVar3[1] + (float)uVar65;
                        fVar81 = pfVar3[2] + (float)((ulong)uVar65 >> 0x20);
                        fVar99 = pfVar3[10] * *(float *)((long)pAVar17 + lVar74 + -8);
                        local_168.l.vy.field_0._8_1_ = true;
                        fVar105 = pfVar3[0xb];
                        fVar125 = pfVar3[3];
                        fVar94 = pfVar3[0xc];
                        fVar107 = pfVar3[0xd];
                        fVar113 = pfVar3[0xe];
                        fVar106 = pfVar3[0xf];
                        uVar62 = pfVar3[4];
                        uVar118 = pfVar3[5] * *(float *)((long)pAVar17 + lVar74 + -0x1c);
                        fVar128 = pfVar3[6] +
                                  *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 8);
                        fVar111 = pfVar3[7];
                      }
                    }
                  }
                }
                else {
                  pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x24);
                  auVar24._4_4_ = -(uint)(pfVar4[1] != 0.0);
                  auVar24._0_4_ = -(uint)(*pfVar4 != 0.0);
                  auVar24._8_4_ = -(uint)(pfVar4[2] != 1.0);
                  auVar24._12_4_ = -(uint)(pfVar4[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar24);
                  if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                     (((uVar75 & 4) != 0 ||
                      (bVar69 = ((byte)uVar75 & 8) >> 3,
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))))
                  goto LAB_00163c8d;
                  pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x14);
                  auVar25._4_4_ = -(uint)(pfVar4[1] != 0.0);
                  auVar25._0_4_ = -(uint)(*pfVar4 != 0.0);
                  auVar25._8_4_ = -(uint)(pfVar4[2] != 0.0);
                  auVar25._12_4_ = -(uint)(pfVar4[3] != 1.0);
                  uVar75 = movmskps(uVar75,auVar25);
                  if (((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                      ((uVar75 & 4) != 0)) ||
                     (bVar69 = ((byte)uVar75 & 8) >> 3,
                     uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0)) goto LAB_00163c8d;
                  pfVar4 = (float *)((long)pAVar17 + lVar74 + -4);
                  auVar26._4_4_ = -(uint)(pfVar4[1] != 0.0);
                  auVar26._0_4_ = -(uint)(*pfVar4 != 0.0);
                  auVar26._8_4_ = -(uint)(pfVar4[2] != 0.0);
                  auVar26._12_4_ = -(uint)(pfVar4[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar26);
                  if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)
                     ) goto LAB_00163c8d;
                  bVar69 = ((byte)uVar75 & 8) >> 3;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                  uVar70 = (ulong)uVar75;
                  if ((bVar69 != 0) ||
                     ((bVar14 != false &&
                      ((fVar79 = *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc),
                       fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_00163c8d;
                  fVar80 = *pfVar3;
                  local_198 = pfVar3[1];
                  fVar81 = pfVar3[2];
                  fVar125 = pfVar3[3];
                  uVar62 = pfVar3[4];
                  uVar118 = pfVar3[5];
                  fVar128 = pfVar3[6];
                  fVar111 = pfVar3[7];
                  fVar79 = pfVar3[8];
                  fVar97 = pfVar3[9];
                  fVar99 = pfVar3[10];
                  fVar105 = pfVar3[0xb];
                  fVar94 = pfVar3[0xc];
                  fVar107 = pfVar3[0xd];
                  fVar113 = pfVar3[0xe];
                  fVar106 = pfVar3[0xf];
                  local_168.l.vy.field_0._8_1_ = bVar61;
                }
LAB_001643d5:
                pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x30))->
                                          field_0 + lVar74);
                *pfVar3 = fVar80;
                pfVar3[1] = local_198;
                pfVar3[2] = fVar81;
                pfVar3[3] = fVar125;
                pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x20))->
                                          field_0 + lVar74);
                *pfVar3 = (float)uVar62;
                pfVar3[1] = (float)uVar118;
                pfVar3[2] = fVar128;
                pfVar3[3] = fVar111;
                pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x10))->
                                          field_0 + lVar74);
                *pfVar3 = fVar79;
                pfVar3[1] = fVar97;
                pfVar3[2] = fVar99;
                pfVar3[3] = fVar105;
                pfVar3 = (float *)(local_168.l.vy.field_0._0_8_ + lVar74);
                *pfVar3 = fVar94;
                pfVar3[1] = fVar107;
                pfVar3[2] = fVar113;
                pfVar3[3] = fVar106;
                uVar71 = uVar71 + 1;
                lVar74 = lVar74 + 0x40;
                uVar65 = local_168.l.vy.field_0._0_8_;
              } while (uVar71 < (pTVar2->spaces).size_active);
            }
          }
          else {
            if (sVar16 != plVar63[0xf]) {
              prVar67 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar67,"number of transformations does not match");
              __cxa_throw(prVar67,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            fVar79 = (pTVar2->time_range).lower;
            fVar81 = (pTVar2->time_range).upper;
            fVar97 = (float)plVar63[0xd];
            fVar125 = (float)((ulong)plVar63[0xd] >> 0x20);
            uVar75 = -(uint)(fVar79 < fVar97);
            uVar77 = -(uint)(fVar81 < fVar125);
            local_178._0_8_ =
                 CONCAT44(~uVar77 & (uint)fVar125,~uVar75 & (uint)fVar79) |
                 CONCAT44((uint)fVar81 & uVar77,(uint)fVar97 & uVar75);
            local_168.l.vx.field_0._0_8_ = 0;
            local_168.l.vx.field_0._8_8_ = 0;
            local_168.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            if (sVar16 != 0) {
              local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar16 << 6,0x10);
              uVar70 = extraout_RDX_08;
              local_168.l.vx.field_0._8_8_ = sVar16;
            }
            uVar65 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (pTVar2->quaternion == false) {
              uVar65 = ZEXT48(*(uint *)(plVar63 + 0x12));
            }
            local_168.l.vy.field_0._8_1_ = (undefined1)uVar65;
            local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
            if ((pTVar2->spaces).size_active != 0) {
              lVar74 = 0x30;
              uVar71 = 0;
              do {
                uVar75 = (uint)uVar70;
                pAVar17 = (pTVar2->spaces).items;
                lVar18 = plVar63[0x11];
                bVar14 = pTVar2->quaternion;
                uVar68 = (undefined7)((ulong)uVar65 >> 8);
                uVar64 = CONCAT71(uVar68,bVar14);
                bVar61 = *(byte *)(plVar63 + 0x12);
                local_168.l.vy.field_0._8_1_ = false;
                fVar79 = *(float *)((long)pAVar17 + lVar74 + -0x30);
                uVar65 = *(undefined8 *)((long)pAVar17 + lVar74 + -0x2c);
                fVar81 = (float)((ulong)uVar65 >> 0x20);
                local_198 = (float)uVar65;
                if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_198 != 0.0)) ||
                   (((NAN(local_198) || (fVar81 != 0.0)) || (NAN(fVar81))))) {
LAB_00164985:
                  uVar65 = *(undefined8 *)(lVar18 + -0x30 + lVar74);
                  fVar97 = (float)uVar65;
                  fVar125 = (float)((ulong)uVar65 >> 0x20);
                  iVar76 = -(uint)(fVar97 != 1.0);
                  iVar78 = -(uint)(fVar125 != 0.0);
                  auVar87._4_4_ = iVar78;
                  auVar87._0_4_ = iVar76;
                  auVar87._8_4_ = iVar78;
                  auVar87._12_4_ = iVar78;
                  auVar86._8_8_ = auVar87._8_8_;
                  auVar86._4_4_ = iVar76;
                  auVar86._0_4_ = iVar76;
                  uVar75 = movmskpd(uVar75,auVar86);
                  fVar79 = *(float *)(lVar18 + -0x28 + lVar74);
                  if (((uVar75 & 1) == 0) &&
                     (((bVar69 = (byte)uVar75 >> 1, bVar69 == 0 && (fVar79 == 0.0)) &&
                      (!NAN(fVar79))))) {
                    pfVar3 = (float *)(lVar18 + -0x24 + lVar74);
                    auVar49._4_4_ = -(uint)(pfVar3[1] != 0.0);
                    auVar49._0_4_ = -(uint)(*pfVar3 != 0.0);
                    auVar49._8_4_ = -(uint)(pfVar3[2] != 1.0);
                    auVar49._12_4_ = -(uint)(pfVar3[3] != 0.0);
                    uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar69),auVar49);
                    if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       (((uVar75 & 4) == 0 && (bVar69 = ((byte)uVar75 & 8) >> 3, bVar69 == 0)))) {
                      pfVar3 = (float *)(lVar18 + -0x14 + lVar74);
                      auVar50._4_4_ = -(uint)(pfVar3[1] != 0.0);
                      auVar50._0_4_ = -(uint)(*pfVar3 != 0.0);
                      auVar50._8_4_ = -(uint)(pfVar3[2] != 0.0);
                      auVar50._12_4_ = -(uint)(pfVar3[3] != 1.0);
                      uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar69),auVar50);
                      if ((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                         (((uVar75 & 4) == 0 && (bVar69 = ((byte)uVar75 & 8) >> 3, bVar69 == 0)))) {
                        pfVar3 = (float *)(lVar18 + -4 + lVar74);
                        auVar51._4_4_ = -(uint)(pfVar3[1] != 0.0);
                        auVar51._0_4_ = -(uint)(*pfVar3 != 0.0);
                        auVar51._8_4_ = -(uint)(pfVar3[2] != 0.0);
                        auVar51._12_4_ = -(uint)(pfVar3[3] != 0.0);
                        uVar75 = movmskps(CONCAT31((int3)(uVar75 >> 8),bVar69),auVar51);
                        if ((((((bVar61 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                             ((uVar75 & 4) == 0)) &&
                            (bVar69 = ((byte)uVar75 & 8) >> 3,
                            uVar70 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 == 0)) &&
                           ((bVar61 == 0 ||
                            ((fVar80 = *(float *)(lVar18 + 0xc + lVar74), fVar80 == 1.0 &&
                             (!NAN(fVar80))))))) {
                          pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x30);
                          fVar80 = *pfVar3;
                          local_198 = pfVar3[1];
                          fVar81 = pfVar3[2];
                          fVar125 = pfVar3[3];
                          pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x20);
                          uVar62 = *pfVar3;
                          uVar118 = pfVar3[1];
                          fVar128 = pfVar3[2];
                          fVar111 = pfVar3[3];
                          pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x10);
                          fVar79 = *pfVar3;
                          fVar97 = pfVar3[1];
                          fVar99 = pfVar3[2];
                          fVar105 = pfVar3[3];
                          pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                          fVar94 = *pfVar3;
                          fVar107 = pfVar3[1];
                          fVar113 = pfVar3[2];
                          fVar106 = pfVar3[3];
                          local_168.l.vy.field_0._8_1_ = bVar14;
                          goto LAB_001650e4;
                        }
                      }
                    }
                  }
                  uVar70 = uVar64 & 0xffffffff;
                  bVar69 = (byte)uVar70 | bVar61;
                  uVar70 = CONCAT71((int7)(uVar70 >> 8),bVar69);
                  if (bVar69 == 0) {
                    pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x30);
                    fVar113 = *pfVar3;
                    fVar126 = pfVar3[1];
                    fVar127 = pfVar3[2];
                    fVar129 = pfVar3[3];
                    pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x20);
                    fVar135 = *pfVar3;
                    fVar138 = pfVar3[1];
                    fVar95 = pfVar3[2];
                    fVar96 = pfVar3[3];
                    pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x10);
                    fVar100 = *pfVar3;
                    fVar131 = pfVar3[1];
                    fVar101 = pfVar3[2];
                    fVar102 = pfVar3[3];
                    fVar80 = fVar97 * fVar113 + fVar125 * fVar135 + fVar79 * fVar100;
                    local_198 = fVar97 * fVar126 + fVar125 * fVar138 + fVar79 * fVar131;
                    fVar81 = fVar97 * fVar127 + fVar125 * fVar95 + fVar79 * fVar101;
                    fVar125 = fVar97 * fVar129 + fVar125 * fVar96 + fVar79 * fVar102;
                    fVar79 = *(float *)(lVar18 + -0x20 + lVar74);
                    fVar97 = *(float *)(lVar18 + -0x1c + lVar74);
                    fVar111 = *(float *)(lVar18 + -0x18 + lVar74);
                    fVar105 = *(float *)(lVar18 + -0x10 + lVar74);
                    uVar62 = fVar79 * fVar113 + fVar97 * fVar135 + fVar111 * fVar100;
                    uVar118 = fVar79 * fVar126 + fVar97 * fVar138 + fVar111 * fVar131;
                    fVar128 = fVar79 * fVar127 + fVar97 * fVar95 + fVar111 * fVar101;
                    fVar111 = fVar79 * fVar129 + fVar97 * fVar96 + fVar111 * fVar102;
                    fVar94 = *(float *)(lVar18 + -0xc + lVar74);
                    fVar107 = *(float *)(lVar18 + -8 + lVar74);
                    fVar79 = fVar105 * fVar113 + fVar94 * fVar135 + fVar107 * fVar100;
                    fVar97 = fVar105 * fVar126 + fVar94 * fVar138 + fVar107 * fVar131;
                    fVar99 = fVar105 * fVar127 + fVar94 * fVar95 + fVar107 * fVar101;
                    fVar105 = fVar105 * fVar129 + fVar94 * fVar96 + fVar107 * fVar102;
                    fVar106 = *(float *)(lVar18 + lVar74);
                    fVar10 = *(float *)(lVar18 + 4 + lVar74);
                    fVar98 = *(float *)(lVar18 + 8 + lVar74);
                    pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                    fVar94 = fVar106 * fVar113 + fVar10 * fVar135 + fVar98 * fVar100 + *pfVar3;
                    fVar107 = fVar106 * fVar126 + fVar10 * fVar138 + fVar98 * fVar131 + pfVar3[1];
                    fVar113 = fVar106 * fVar127 + fVar10 * fVar95 + fVar98 * fVar101 + pfVar3[2];
                    fVar106 = fVar106 * fVar129 + fVar10 * fVar96 + fVar98 * fVar102 + pfVar3[3];
                  }
                  else {
                    uVar64 = uVar64 & 0xffffffff;
                    bVar69 = (byte)uVar64 & bVar61;
                    uVar70 = CONCAT71((int7)(uVar64 >> 8),bVar69);
                    if (bVar69 == 1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                      std::ostream::put(-0x38);
                      std::ostream::flush();
                      fVar79 = *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc);
                      fVar81 = *(float *)((long)pAVar17 + lVar74 + -0x24);
                      fVar97 = *(float *)((long)pAVar17 + lVar74 + -0x14);
                      fVar125 = *(float *)((long)pAVar17 + lVar74 + -4);
                      auVar13 = *(undefined1 (*) [16])((long)pAVar17 + lVar74 + -0x30);
                      pfVar4 = (float *)((long)pAVar17 + lVar74 + -0x20);
                      fVar80 = *pfVar4;
                      fVar128 = pfVar4[1];
                      pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x10);
                      fVar111 = *pfVar3;
                      fVar99 = pfVar3[1];
                      fVar105 = pfVar3[2];
                      fVar129 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar107 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar113 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                                -fVar125 * fVar125;
                      fVar126 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar127 = fVar97 * fVar97 + fVar126 + -fVar125 * fVar125;
                      fVar138 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar94 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar135 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar79 = fVar97 * fVar125 - fVar79 * fVar81;
                      pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                      fVar106 = *pfVar3;
                      fVar10 = pfVar3[1];
                      fVar98 = pfVar3[2];
                      fVar129 = fVar129 + fVar129;
                      fVar138 = fVar138 + fVar138;
                      fVar107 = fVar107 + fVar107;
                      fVar135 = fVar135 + fVar135;
                      fVar94 = fVar94 + fVar94;
                      fVar79 = fVar79 + fVar79;
                      fVar81 = fVar125 * fVar125 + fVar126 + -fVar97 * fVar97;
                      fVar114 = fVar113 * 1.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar116 = fVar113 * 0.0 + fVar129 * 1.0 + fVar138 * 0.0;
                      fVar119 = fVar113 * 0.0 + fVar129 * 0.0 + fVar138 * 1.0;
                      fVar121 = fVar113 * 0.0 + fVar129 * 0.0 + fVar138 * 0.0;
                      fVar108 = fVar107 * 1.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar109 = fVar107 * 0.0 + fVar127 * 1.0 + fVar135 * 0.0;
                      fVar110 = fVar107 * 0.0 + fVar127 * 0.0 + fVar135 * 1.0;
                      fVar112 = fVar107 * 0.0 + fVar127 * 0.0 + fVar135 * 0.0;
                      fVar107 = fVar94 * 1.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      fVar113 = fVar94 * 0.0 + fVar79 * 1.0 + fVar81 * 0.0;
                      fVar129 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 1.0;
                      fVar138 = fVar94 * 0.0 + fVar79 * 0.0 + fVar81 * 0.0;
                      local_188 = auVar13._4_4_;
                      fStack_184 = auVar13._8_4_;
                      local_198 = auVar13._0_4_;
                      fVar130 = local_198 * fVar114 + fVar108 * 0.0 + fVar107 * 0.0;
                      fVar132 = local_198 * fVar116 + fVar109 * 0.0 + fVar113 * 0.0;
                      fVar133 = local_198 * fVar119 + fVar110 * 0.0 + fVar129 * 0.0;
                      fVar134 = local_198 * fVar121 + fVar112 * 0.0 + fVar138 * 0.0;
                      fVar126 = fVar80 * fVar114 + fVar128 * fVar108 + fVar107 * 0.0;
                      fVar127 = fVar80 * fVar116 + fVar128 * fVar109 + fVar113 * 0.0;
                      fVar135 = fVar80 * fVar119 + fVar128 * fVar110 + fVar129 * 0.0;
                      fVar95 = fVar80 * fVar121 + fVar128 * fVar112 + fVar138 * 0.0;
                      local_168.l.vz.field_0.m128[0] =
                           fVar111 * fVar114 + fVar99 * fVar108 + fVar105 * fVar107;
                      local_168.l.vz.field_0.m128[1] =
                           fVar111 * fVar116 + fVar99 * fVar109 + fVar105 * fVar113;
                      local_168.l.vz.field_0.m128[2] =
                           fVar111 * fVar119 + fVar99 * fVar110 + fVar105 * fVar129;
                      local_168.l.vz.field_0.m128[3] =
                           fVar111 * fVar121 + fVar99 * fVar112 + fVar105 * fVar138;
                      fVar79 = *(float *)(lVar18 + 0xc + lVar74);
                      fVar81 = *(float *)(lVar18 + -0x24 + lVar74);
                      fVar97 = *(float *)(lVar18 + -0x14 + lVar74);
                      fVar125 = *(float *)(lVar18 + -4 + lVar74);
                      fVar131 = fVar81 * fVar97 + fVar79 * fVar125;
                      fVar96 = fVar81 * fVar97 - fVar79 * fVar125;
                      fVar100 = fVar79 * fVar79 + fVar81 * fVar81 + -fVar97 * fVar97 +
                                -fVar125 * fVar125;
                      fVar128 = fVar79 * fVar79 - fVar81 * fVar81;
                      fVar137 = fVar97 * fVar97 + fVar128 + -fVar125 * fVar125;
                      fVar136 = fVar81 * fVar125 - fVar79 * fVar97;
                      fVar103 = fVar79 * fVar97 + fVar81 * fVar125;
                      fVar139 = fVar97 * fVar125 + fVar79 * fVar81;
                      fVar94 = fVar97 * fVar125 - fVar79 * fVar81;
                      pfVar5 = (float *)(lVar18 + -0x30 + lVar74);
                      fVar79 = *pfVar5;
                      pfVar6 = (float *)(lVar18 + -0x20 + lVar74);
                      fVar81 = *pfVar6;
                      fVar80 = pfVar6[1];
                      fVar122 = fVar125 * fVar125 + fVar128 + -fVar97 * fVar97;
                      pfVar3 = (float *)(lVar18 + -0x10 + lVar74);
                      fVar97 = *pfVar3;
                      fVar125 = pfVar3[1];
                      fVar128 = pfVar3[2];
                      fVar131 = fVar131 + fVar131;
                      fVar136 = fVar136 + fVar136;
                      pfVar3 = (float *)(lVar18 + lVar74);
                      fVar111 = *pfVar3;
                      fVar99 = pfVar3[1];
                      fVar105 = pfVar3[2];
                      fVar101 = fVar100 * 1.0 + fVar131 * 0.0 + fVar136 * 0.0;
                      fVar102 = fVar100 * 0.0 + fVar131 * 1.0 + fVar136 * 0.0;
                      fVar136 = fVar100 * 0.0 + fVar131 * 0.0 + fVar136 * 1.0;
                      fVar96 = fVar96 + fVar96;
                      fVar139 = fVar139 + fVar139;
                      fVar103 = fVar103 + fVar103;
                      fVar94 = fVar94 + fVar94;
                      fVar100 = fVar96 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                      fVar131 = fVar96 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                      fVar96 = fVar96 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                      fVar137 = fVar103 * 1.0 + fVar94 * 0.0 + fVar122 * 0.0;
                      fVar139 = fVar103 * 0.0 + fVar94 * 1.0 + fVar122 * 0.0;
                      fVar94 = fVar103 * 0.0 + fVar94 * 0.0 + fVar122 * 1.0;
                      fVar115 = fVar79 * fVar101 + fVar100 * 0.0 + fVar137 * 0.0;
                      fVar117 = fVar79 * fVar102 + fVar131 * 0.0 + fVar139 * 0.0;
                      fVar120 = fVar79 * fVar136 + fVar96 * 0.0 + fVar94 * 0.0;
                      fVar103 = fVar81 * fVar101 + fVar80 * fVar100 + fVar137 * 0.0;
                      fVar122 = fVar81 * fVar102 + fVar80 * fVar131 + fVar139 * 0.0;
                      fVar104 = fVar81 * fVar136 + fVar80 * fVar96 + fVar94 * 0.0;
                      fVar123 = fVar97 * fVar101 + fVar125 * fVar100 + fVar128 * fVar137;
                      fVar124 = fVar97 * fVar102 + fVar125 * fVar131 + fVar128 * fVar139;
                      fVar125 = fVar97 * fVar136 + fVar125 * fVar96 + fVar128 * fVar94;
                      fVar128 = fVar111 * fVar101 + fVar99 * fVar100 + fVar105 * fVar137 +
                                pfVar5[1] + 0.0;
                      fVar100 = fVar111 * fVar102 + fVar99 * fVar131 + fVar105 * fVar139 +
                                pfVar5[2] + 0.0;
                      fVar111 = fVar111 * fVar136 + fVar99 * fVar96 + fVar105 * fVar94 +
                                pfVar6[2] + 0.0;
                      fVar80 = fVar115 * fVar130 +
                               fVar117 * fVar126 + fVar120 * local_168.l.vz.field_0.m128[0];
                      local_198 = fVar115 * fVar132 +
                                  fVar117 * fVar127 + fVar120 * local_168.l.vz.field_0.m128[1];
                      fVar81 = fVar115 * fVar133 +
                               fVar117 * fVar135 + fVar120 * local_168.l.vz.field_0.m128[2];
                      fVar79 = fVar123 * fVar130 +
                               fVar124 * fVar126 + fVar125 * local_168.l.vz.field_0.m128[0];
                      fVar97 = fVar123 * fVar132 +
                               fVar124 * fVar127 + fVar125 * local_168.l.vz.field_0.m128[1];
                      fVar99 = fVar123 * fVar133 +
                               fVar124 * fVar135 + fVar125 * local_168.l.vz.field_0.m128[2];
                      uVar70 = extraout_RDX_09;
                      fVar105 = fVar123 * fVar134 +
                                fVar124 * fVar95 + fVar125 * local_168.l.vz.field_0.m128[3];
                      fVar125 = fVar115 * fVar134 +
                                fVar117 * fVar95 + fVar120 * local_168.l.vz.field_0.m128[3];
                      fVar94 = fVar128 * fVar130 +
                               fVar100 * fVar126 + fVar111 * local_168.l.vz.field_0.m128[0] +
                               fVar106 * fVar114 + fVar10 * fVar108 + fVar98 * fVar107 +
                               local_188 + 0.0;
                      fVar107 = fVar128 * fVar132 +
                                fVar100 * fVar127 + fVar111 * local_168.l.vz.field_0.m128[1] +
                                fVar106 * fVar116 + fVar10 * fVar109 + fVar98 * fVar113 +
                                fStack_184 + 0.0;
                      fVar113 = fVar128 * fVar133 +
                                fVar100 * fVar135 + fVar111 * local_168.l.vz.field_0.m128[2] +
                                fVar106 * fVar119 + fVar10 * fVar110 + fVar98 * fVar129 +
                                pfVar4[2] + 0.0;
                      fVar106 = fVar128 * fVar134 +
                                fVar100 * fVar95 + fVar111 * local_168.l.vz.field_0.m128[3] +
                                fVar106 * fVar121 + fVar10 * fVar112 + fVar98 * fVar138 + 0.0;
                      uVar62 = fVar103 * fVar130 +
                               fVar122 * fVar126 + fVar104 * local_168.l.vz.field_0.m128[0];
                      uVar118 = fVar103 * fVar132 +
                                fVar122 * fVar127 + fVar104 * local_168.l.vz.field_0.m128[1];
                      fVar128 = fVar103 * fVar133 +
                                fVar122 * fVar135 + fVar104 * local_168.l.vz.field_0.m128[2];
                      fVar111 = fVar103 * fVar134 +
                                fVar122 * fVar95 + fVar104 * local_168.l.vz.field_0.m128[3];
                    }
                    else {
                      bVar61 = bVar14 ^ 1U | bVar61;
                      if (bVar61 == 0) {
                        local_f8 = ZEXT416(*(uint *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc))
                        ;
                        local_d8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                    )ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -0x24));
                        local_c8 = ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -0x14));
                        local_108 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                     )ZEXT416(*(uint *)((long)pAVar17 + lVar74 + -4));
                        paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                  *)((long)pAVar17 + lVar74 + -0x20);
                        fVar113 = paVar8->x;
                        fVar106 = paVar8->y;
                        local_128._0_4_ = paVar8->x;
                        local_128._4_4_ = paVar8->y;
                        fVar10 = (paVar8->field_3).w;
                        local_e8 = *paVar8;
                        pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x10);
                        local_118 = *pfVar3;
                        fStack_114 = pfVar3[1];
                        fStack_110 = pfVar3[2];
                        fStack_10c = pfVar3[3];
                        pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x30);
                        local_a8._0_4_ = *pfVar3;
                        fStack_9c = pfVar3[1];
                        pfVar3 = (float *)(lVar18 + -0x30 + lVar74);
                        fVar79 = *pfVar3;
                        fVar97 = pfVar3[1];
                        fVar125 = pfVar3[2];
                        pfVar3 = (float *)(lVar18 + -0x20 + lVar74);
                        fVar128 = *pfVar3;
                        fVar111 = pfVar3[1];
                        fVar99 = pfVar3[2];
                        puVar7 = (ulong *)(lVar18 + -0x10 + lVar74);
                        local_78 = *puVar7;
                        uStack_70 = puVar7[1];
                        pfVar3 = (float *)(lVar18 + lVar74);
                        fVar105 = *pfVar3;
                        fVar94 = pfVar3[1];
                        fVar107 = pfVar3[2];
                        fVar80 = fVar79 * (float)local_a8._0_4_ +
                                 fVar97 * fVar113 + fVar125 * local_118;
                        fVar98 = fVar79 * 0.0 + fVar97 * fVar106 + fVar125 * fStack_114;
                        fVar79 = fVar79 * 0.0 + fVar97 * 0.0 + fVar125 * fStack_110;
                        local_168.l.vz.field_0.m128[0] =
                             fVar128 * (float)local_a8._0_4_ +
                             fVar111 * fVar113 + fVar99 * local_118;
                        local_168.l.vz.field_0.m128[1] =
                             fVar128 * 0.0 + fVar111 * fVar106 + fVar99 * fStack_114;
                        local_168.l.vz.field_0.m128[2] =
                             fVar128 * 0.0 + fVar111 * 0.0 + fVar99 * fStack_110;
                        local_168.l.vz.field_0.m128[3] =
                             fVar128 * fStack_9c + fVar111 * fVar10 + fVar99 * fStack_10c;
                        lStack_120 = (ulong)(uint)fVar10 << 0x20;
                        stack0xffffffffffffff5c = 0;
                        pfVar3 = (float *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                        local_b8._0_4_ =
                             fVar105 * (float)local_a8._0_4_ +
                             fVar94 * fVar113 + fVar107 * local_118 + *pfVar3;
                        local_b8._4_4_ =
                             fVar105 * 0.0 + fVar94 * fVar106 + fVar107 * fStack_114 + pfVar3[1];
                        fStack_b0 = fVar105 * 0.0 + fVar94 * 0.0 + fVar107 * fStack_110 + pfVar3[2];
                        register0x0000128c =
                             fVar105 * fStack_9c + fVar94 * fVar10 + fVar107 * fStack_10c +
                             pfVar3[3];
                        if (((fVar98 != 0.0) || (NAN(fVar98))) ||
                           ((fVar79 != 0.0 ||
                            (((NAN(fVar79) || (local_168.l.vz.field_0.m128[2] != 0.0)) ||
                             (NAN(local_168.l.vz.field_0.m128[2]))))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_11;
                        }
                        fVar79 = (float)local_a8._0_4_ * (float)local_78 +
                                 (float)local_128 * local_78._4_4_ + local_118 * (float)uStack_70;
                        fVar97 = (float)local_a8._4_4_ * (float)local_78 +
                                 local_128._4_4_ * local_78._4_4_ + fStack_114 * (float)uStack_70;
                        fVar99 = fStack_a0 * (float)local_78 +
                                 (float)lStack_120 * local_78._4_4_ + fStack_110 * (float)uStack_70;
                        local_168.l.vy.field_0._8_1_ = true;
                        fVar105 = local_108.x;
                        fVar125 = local_d8.x;
                        fVar94 = (float)local_b8._0_4_;
                        fVar107 = (float)local_b8._4_4_;
                        fVar113 = fStack_b0;
                        fVar106 = (float)local_f8._0_4_;
                        uVar62 = local_168.l.vz.field_0.m128[0];
                        uVar118 = local_168.l.vz.field_0.m128[1];
                        fVar128 = local_e8.z;
                        fVar111 = (float)local_c8._0_4_;
                      }
                      else {
                        if (((local_198 != 0.0) || (NAN(local_198))) ||
                           ((fVar81 != 0.0 ||
                            ((NAN(fVar81) ||
                             (uVar65 = *(undefined8 *)((long)pAVar17 + lVar74 + -0x10),
                             auVar31._4_4_ =
                                  -(uint)(*(float *)((long)pAVar17 + lVar74 + -0x20) != 0.0),
                             auVar31._0_4_ =
                                  -(uint)(*(float *)((long)pAVar17 + lVar74 + -0x18) != 0.0),
                             auVar31._8_4_ = -(uint)((float)uVar65 != 0.0),
                             auVar31._12_4_ = -(uint)((float)((ulong)uVar65 >> 0x20) != 0.0),
                             uVar62 = movmskps((int)CONCAT71(uVar68,bVar61),auVar31),
                             (char)uVar62 != '\0')))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                          std::ostream::put(-0x38);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_10;
                        }
                        pfVar4 = (float *)(lVar18 + -0x30 + lVar74);
                        pfVar5 = (float *)(lVar18 + -0x20 + lVar74);
                        pfVar6 = (float *)(lVar18 + -0x10 + lVar74);
                        fVar79 = *pfVar6;
                        fVar97 = pfVar6[1];
                        pfVar3 = (float *)(lVar18 + lVar74);
                        uVar65 = *(undefined8 *)((long)&(pAVar17->l).vx.field_0 + lVar74);
                        fVar80 = *(float *)((long)pAVar17 + lVar74 + -0x30) * *pfVar4;
                        local_198 = pfVar4[1] + (float)uVar65;
                        fVar81 = pfVar4[2] + (float)((ulong)uVar65 >> 0x20);
                        fVar99 = pfVar6[2] * *(float *)((long)pAVar17 + lVar74 + -8);
                        local_168.l.vy.field_0._8_1_ = true;
                        fVar105 = pfVar6[3];
                        fVar125 = pfVar4[3];
                        fVar94 = *pfVar3;
                        fVar107 = pfVar3[1];
                        fVar113 = pfVar3[2];
                        fVar106 = pfVar3[3];
                        uVar62 = *pfVar5;
                        uVar118 = pfVar5[1] * *(float *)((long)pAVar17 + lVar74 + -0x1c);
                        fVar128 = pfVar5[2] +
                                  *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 8);
                        fVar111 = pfVar5[3];
                      }
                    }
                  }
                }
                else {
                  pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x24);
                  auVar28._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar28._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar28._8_4_ = -(uint)(pfVar3[2] != 1.0);
                  auVar28._12_4_ = -(uint)(pfVar3[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar28);
                  if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                     (((uVar75 & 4) != 0 ||
                      (bVar69 = ((byte)uVar75 & 8) >> 3,
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))))
                  goto LAB_00164985;
                  pfVar3 = (float *)((long)pAVar17 + lVar74 + -0x14);
                  auVar29._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar29._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar29._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar29._12_4_ = -(uint)(pfVar3[3] != 1.0);
                  uVar75 = movmskps(uVar75,auVar29);
                  if (((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                      ((uVar75 & 4) != 0)) ||
                     (bVar69 = ((byte)uVar75 & 8) >> 3,
                     uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0)) goto LAB_00164985;
                  pfVar3 = (float *)((long)pAVar17 + lVar74 + -4);
                  auVar30._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar30._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar30._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar30._12_4_ = -(uint)(pfVar3[3] != 0.0);
                  uVar75 = movmskps(uVar75,auVar30);
                  if ((((bVar14 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)
                     ) goto LAB_00164985;
                  bVar69 = ((byte)uVar75 & 8) >> 3;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                  uVar70 = (ulong)uVar75;
                  if ((bVar69 != 0) ||
                     ((bVar14 != false &&
                      ((fVar79 = *(float *)((long)&(pAVar17->l).vx.field_0 + lVar74 + 0xc),
                       fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_00164985;
                  pfVar3 = (float *)(lVar18 + -0x30 + lVar74);
                  fVar80 = *pfVar3;
                  local_198 = pfVar3[1];
                  fVar81 = pfVar3[2];
                  fVar125 = pfVar3[3];
                  pfVar3 = (float *)(lVar18 + -0x20 + lVar74);
                  uVar62 = *pfVar3;
                  uVar118 = pfVar3[1];
                  fVar128 = pfVar3[2];
                  fVar111 = pfVar3[3];
                  pfVar3 = (float *)(lVar18 + -0x10 + lVar74);
                  fVar79 = *pfVar3;
                  fVar97 = pfVar3[1];
                  fVar99 = pfVar3[2];
                  fVar105 = pfVar3[3];
                  pfVar3 = (float *)(lVar18 + lVar74);
                  fVar94 = *pfVar3;
                  fVar107 = pfVar3[1];
                  fVar113 = pfVar3[2];
                  fVar106 = pfVar3[3];
                  local_168.l.vy.field_0._8_1_ = bVar61;
                }
LAB_001650e4:
                pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x30))->
                                          field_0 + lVar74);
                *pfVar3 = fVar80;
                pfVar3[1] = local_198;
                pfVar3[2] = fVar81;
                pfVar3[3] = fVar125;
                pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x20))->
                                          field_0 + lVar74);
                *pfVar3 = (float)uVar62;
                pfVar3[1] = (float)uVar118;
                pfVar3[2] = fVar128;
                pfVar3[3] = fVar111;
                pfVar3 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x10))->
                                          field_0 + lVar74);
                *pfVar3 = fVar79;
                pfVar3[1] = fVar97;
                pfVar3[2] = fVar99;
                pfVar3[3] = fVar105;
                pfVar3 = (float *)(local_168.l.vy.field_0._0_8_ + lVar74);
                *pfVar3 = fVar94;
                pfVar3[1] = fVar107;
                pfVar3[2] = fVar113;
                pfVar3[3] = fVar106;
                uVar71 = uVar71 + 1;
                lVar74 = lVar74 + 0x40;
                uVar65 = local_168.l.vy.field_0._0_8_;
              } while (uVar71 < (pTVar2->spaces).size_active);
            }
          }
          convertInstances(local_80,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                     *)local_88,local_90,(Transformations *)local_178);
          alignedFree((void *)local_168.l.vy.field_0._0_8_);
          uVar71 = local_68 + 1;
          pTVar66 = *(pointer *)local_168.p.field_0._8_8_;
          uVar70 = 0xaaaaaaaaaaaaaaab;
        } while (uVar71 < (ulong)(((long)*(pointer *)(local_168.p.field_0._8_8_ + 8) - (long)pTVar66
                                  >> 4) * -0x5555555555555555));
      }
      (**(code **)(*plVar63 + 0x18))(plVar63);
    }
  }
  return;
}

Assistant:

void convertInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const std::vector<SceneGraph::Transformations>& spaces)
    {
      if (node->isClosed()) {
        //if (group.size() % 10000 == 0) std::cout << "." << std::flush;
        group.push_back(new SceneGraph::MultiTransformNode(spaces,lookupGeometries(node)));
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        for (size_t i = 0; i < spaces.size(); ++i)
          convertInstances(group,xfmNode->child, spaces[i]*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
        convertInstances(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertInstances(group,child,spaces);
      }
    }